

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O3

void idct64_low32_avx2(__m256i *input,__m256i *output)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  __m256i alVar84;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_e80 [32];
  undefined4 uStack_a74;
  undefined4 uStack_a70;
  undefined4 uStack_a6c;
  undefined4 uStack_a68;
  undefined4 uStack_a64;
  undefined4 uStack_a54;
  undefined4 uStack_a50;
  undefined4 uStack_a4c;
  undefined4 uStack_a48;
  undefined4 uStack_a44;
  __m256i local_860 [2];
  __m256i local_820;
  __m256i local_7e0;
  __m256i local_7a0;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_860[0] = *input;
  local_820 = input[0x10];
  local_7e0 = input[8];
  local_7a0 = input[0x18];
  alVar84 = input[0x12];
  uStack_a74 = (undefined4)((ulong)input[0x1a][1] >> 0x20);
  uStack_a70 = (undefined4)input[0x1a][2];
  uStack_a6c = (undefined4)((ulong)input[0x1a][2] >> 0x20);
  uStack_a68 = (undefined4)input[0x1a][3];
  uStack_a64 = (undefined4)((ulong)input[0x1a][3] >> 0x20);
  uStack_a54 = (undefined4)((ulong)input[6][1] >> 0x20);
  uStack_a50 = (undefined4)input[6][2];
  uStack_a4c = (undefined4)((ulong)input[6][2] >> 0x20);
  uStack_a48 = (undefined4)input[6][3];
  uStack_a44 = (undefined4)((ulong)input[6][3] >> 0x20);
  auVar38._8_2_ = 0x328;
  auVar38._0_8_ = 0x328032803280328;
  auVar38._10_2_ = 0x328;
  auVar38._12_2_ = 0x328;
  auVar38._14_2_ = 0x328;
  auVar38._16_2_ = 0x328;
  auVar38._18_2_ = 0x328;
  auVar38._20_2_ = 0x328;
  auVar38._22_2_ = 0x328;
  auVar38._24_2_ = 0x328;
  auVar38._26_2_ = 0x328;
  auVar38._28_2_ = 0x328;
  auVar38._30_2_ = 0x328;
  auVar63 = vpmulhrsw_avx2((undefined1  [32])input[1],auVar38);
  auVar69._8_2_ = 0x7ff8;
  auVar69._0_8_ = 0x7ff87ff87ff87ff8;
  auVar69._10_2_ = 0x7ff8;
  auVar69._12_2_ = 0x7ff8;
  auVar69._14_2_ = 0x7ff8;
  auVar69._16_2_ = 0x7ff8;
  auVar69._18_2_ = 0x7ff8;
  auVar69._20_2_ = 0x7ff8;
  auVar69._22_2_ = 0x7ff8;
  auVar69._24_2_ = 0x7ff8;
  auVar69._26_2_ = 0x7ff8;
  auVar69._28_2_ = 0x7ff8;
  auVar69._30_2_ = 0x7ff8;
  auVar69 = vpmulhrsw_avx2((undefined1  [32])input[1],auVar69);
  auVar52._8_2_ = 0xa7c0;
  auVar52._0_8_ = 0xa7c0a7c0a7c0a7c0;
  auVar52._10_2_ = 0xa7c0;
  auVar52._12_2_ = 0xa7c0;
  auVar52._14_2_ = 0xa7c0;
  auVar52._16_2_ = 0xa7c0;
  auVar52._18_2_ = 0xa7c0;
  auVar52._20_2_ = 0xa7c0;
  auVar52._22_2_ = 0xa7c0;
  auVar52._24_2_ = 0xa7c0;
  auVar52._26_2_ = 0xa7c0;
  auVar52._28_2_ = 0xa7c0;
  auVar52._30_2_ = 0xa7c0;
  auVar52 = vpmulhrsw_avx2((undefined1  [32])input[0x1f],auVar52);
  auVar51._8_2_ = 0x5cb8;
  auVar51._0_8_ = 0x5cb85cb85cb85cb8;
  auVar51._10_2_ = 0x5cb8;
  auVar51._12_2_ = 0x5cb8;
  auVar51._14_2_ = 0x5cb8;
  auVar51._16_2_ = 0x5cb8;
  auVar51._18_2_ = 0x5cb8;
  auVar51._20_2_ = 0x5cb8;
  auVar51._22_2_ = 0x5cb8;
  auVar51._24_2_ = 0x5cb8;
  auVar51._26_2_ = 0x5cb8;
  auVar51._28_2_ = 0x5cb8;
  auVar51._30_2_ = 0x5cb8;
  auVar51 = vpmulhrsw_avx2((undefined1  [32])input[0x1f],auVar51);
  auVar70._8_2_ = 0x33e0;
  auVar70._0_8_ = 0x33e033e033e033e0;
  auVar70._10_2_ = 0x33e0;
  auVar70._12_2_ = 0x33e0;
  auVar70._14_2_ = 0x33e0;
  auVar70._16_2_ = 0x33e0;
  auVar70._18_2_ = 0x33e0;
  auVar70._20_2_ = 0x33e0;
  auVar70._22_2_ = 0x33e0;
  auVar70._24_2_ = 0x33e0;
  auVar70._26_2_ = 0x33e0;
  auVar70._28_2_ = 0x33e0;
  auVar70._30_2_ = 0x33e0;
  auVar70 = vpmulhrsw_avx2((undefined1  [32])input[0x11],auVar70);
  auVar53._8_2_ = 0x7508;
  auVar53._0_8_ = 0x7508750875087508;
  auVar53._10_2_ = 0x7508;
  auVar53._12_2_ = 0x7508;
  auVar53._14_2_ = 0x7508;
  auVar53._16_2_ = 0x7508;
  auVar53._18_2_ = 0x7508;
  auVar53._20_2_ = 0x7508;
  auVar53._22_2_ = 0x7508;
  auVar53._24_2_ = 0x7508;
  auVar53._26_2_ = 0x7508;
  auVar53._28_2_ = 0x7508;
  auVar53._30_2_ = 0x7508;
  auVar53 = vpmulhrsw_avx2((undefined1  [32])input[0x11],auVar53);
  auVar65._8_2_ = 0xd1f0;
  auVar65._0_8_ = 0xd1f0d1f0d1f0d1f0;
  auVar65._10_2_ = 0xd1f0;
  auVar65._12_2_ = 0xd1f0;
  auVar65._14_2_ = 0xd1f0;
  auVar65._16_2_ = 0xd1f0;
  auVar65._18_2_ = 0xd1f0;
  auVar65._20_2_ = 0xd1f0;
  auVar65._22_2_ = 0xd1f0;
  auVar65._24_2_ = 0xd1f0;
  auVar65._26_2_ = 0xd1f0;
  auVar65._28_2_ = 0xd1f0;
  auVar65._30_2_ = 0xd1f0;
  auVar65 = vpmulhrsw_avx2((undefined1  [32])input[0xf],auVar65);
  auVar64._8_2_ = 0x7770;
  auVar64._0_8_ = 0x7770777077707770;
  auVar64._10_2_ = 0x7770;
  auVar64._12_2_ = 0x7770;
  auVar64._14_2_ = 0x7770;
  auVar64._16_2_ = 0x7770;
  auVar64._18_2_ = 0x7770;
  auVar64._20_2_ = 0x7770;
  auVar64._22_2_ = 0x7770;
  auVar64._24_2_ = 0x7770;
  auVar64._26_2_ = 0x7770;
  auVar64._28_2_ = 0x7770;
  auVar64._30_2_ = 0x7770;
  auVar64 = vpmulhrsw_avx2((undefined1  [32])input[0xf],auVar64);
  auVar78._8_2_ = 0x1c08;
  auVar78._0_8_ = 0x1c081c081c081c08;
  auVar78._10_2_ = 0x1c08;
  auVar78._12_2_ = 0x1c08;
  auVar78._14_2_ = 0x1c08;
  auVar78._16_2_ = 0x1c08;
  auVar78._18_2_ = 0x1c08;
  auVar78._20_2_ = 0x1c08;
  auVar78._22_2_ = 0x1c08;
  auVar78._24_2_ = 0x1c08;
  auVar78._26_2_ = 0x1c08;
  auVar78._28_2_ = 0x1c08;
  auVar78._30_2_ = 0x1c08;
  auVar78 = vpmulhrsw_avx2((undefined1  [32])input[9],auVar78);
  auVar49._8_2_ = 0x7ce0;
  auVar49._0_8_ = 0x7ce07ce07ce07ce0;
  auVar49._10_2_ = 0x7ce0;
  auVar49._12_2_ = 0x7ce0;
  auVar49._14_2_ = 0x7ce0;
  auVar49._16_2_ = 0x7ce0;
  auVar49._18_2_ = 0x7ce0;
  auVar49._20_2_ = 0x7ce0;
  auVar49._22_2_ = 0x7ce0;
  auVar49._24_2_ = 0x7ce0;
  auVar49._26_2_ = 0x7ce0;
  auVar49._28_2_ = 0x7ce0;
  auVar49._30_2_ = 0x7ce0;
  auVar49 = vpmulhrsw_avx2((undefined1  [32])input[9],auVar49);
  auVar79._8_2_ = 0xbb88;
  auVar79._0_8_ = 0xbb88bb88bb88bb88;
  auVar79._10_2_ = 0xbb88;
  auVar79._12_2_ = 0xbb88;
  auVar79._14_2_ = 0xbb88;
  auVar79._16_2_ = 0xbb88;
  auVar79._18_2_ = 0xbb88;
  auVar79._20_2_ = 0xbb88;
  auVar79._22_2_ = 0xbb88;
  auVar79._24_2_ = 0xbb88;
  auVar79._26_2_ = 0xbb88;
  auVar79._28_2_ = 0xbb88;
  auVar79._30_2_ = 0xbb88;
  auVar79 = vpmulhrsw_avx2((undefined1  [32])input[0x17],auVar79);
  auVar83._8_2_ = 0x6c28;
  auVar83._0_8_ = 0x6c286c286c286c28;
  auVar83._10_2_ = 0x6c28;
  auVar83._12_2_ = 0x6c28;
  auVar83._14_2_ = 0x6c28;
  auVar83._16_2_ = 0x6c28;
  auVar83._18_2_ = 0x6c28;
  auVar83._20_2_ = 0x6c28;
  auVar83._22_2_ = 0x6c28;
  auVar83._24_2_ = 0x6c28;
  auVar83._26_2_ = 0x6c28;
  auVar83._28_2_ = 0x6c28;
  auVar83._30_2_ = 0x6c28;
  auVar83 = vpmulhrsw_avx2((undefined1  [32])input[0x17],auVar83);
  auVar81._8_2_ = 0x49b8;
  auVar81._0_8_ = 0x49b849b849b849b8;
  auVar81._10_2_ = 0x49b8;
  auVar81._12_2_ = 0x49b8;
  auVar81._14_2_ = 0x49b8;
  auVar81._16_2_ = 0x49b8;
  auVar81._18_2_ = 0x49b8;
  auVar81._20_2_ = 0x49b8;
  auVar81._22_2_ = 0x49b8;
  auVar81._24_2_ = 0x49b8;
  auVar81._26_2_ = 0x49b8;
  auVar81._28_2_ = 0x49b8;
  auVar81._30_2_ = 0x49b8;
  auVar81 = vpmulhrsw_avx2((undefined1  [32])input[0x19],auVar81);
  auVar67._8_2_ = 0x68a8;
  auVar67._0_8_ = 0x68a868a868a868a8;
  auVar67._10_2_ = 0x68a8;
  auVar67._12_2_ = 0x68a8;
  auVar67._14_2_ = 0x68a8;
  auVar67._16_2_ = 0x68a8;
  auVar67._18_2_ = 0x68a8;
  auVar67._20_2_ = 0x68a8;
  auVar67._22_2_ = 0x68a8;
  auVar67._24_2_ = 0x68a8;
  auVar67._26_2_ = 0x68a8;
  auVar67._28_2_ = 0x68a8;
  auVar67._30_2_ = 0x68a8;
  auVar67 = vpmulhrsw_avx2((undefined1  [32])input[0x19],auVar67);
  auVar54._8_2_ = 0xea20;
  auVar54._0_8_ = 0xea20ea20ea20ea20;
  auVar54._10_2_ = 0xea20;
  auVar54._12_2_ = 0xea20;
  auVar54._14_2_ = 0xea20;
  auVar54._16_2_ = 0xea20;
  auVar54._18_2_ = 0xea20;
  auVar54._20_2_ = 0xea20;
  auVar54._22_2_ = 0xea20;
  auVar54._24_2_ = 0xea20;
  auVar54._26_2_ = 0xea20;
  auVar54._28_2_ = 0xea20;
  auVar54._30_2_ = 0xea20;
  auVar54 = vpmulhrsw_avx2((undefined1  [32])input[7],auVar54);
  auVar50._8_2_ = 0x7e20;
  auVar50._0_8_ = 0x7e207e207e207e20;
  auVar50._10_2_ = 0x7e20;
  auVar50._12_2_ = 0x7e20;
  auVar50._14_2_ = 0x7e20;
  auVar50._16_2_ = 0x7e20;
  auVar50._18_2_ = 0x7e20;
  auVar50._20_2_ = 0x7e20;
  auVar50._22_2_ = 0x7e20;
  auVar50._24_2_ = 0x7e20;
  auVar50._26_2_ = 0x7e20;
  auVar50._28_2_ = 0x7e20;
  auVar50._30_2_ = 0x7e20;
  auVar50 = vpmulhrsw_avx2((undefined1  [32])input[7],auVar50);
  auVar55._8_2_ = 0xfa8;
  auVar55._0_8_ = 0xfa80fa80fa80fa8;
  auVar55._10_2_ = 0xfa8;
  auVar55._12_2_ = 0xfa8;
  auVar55._14_2_ = 0xfa8;
  auVar55._16_2_ = 0xfa8;
  auVar55._18_2_ = 0xfa8;
  auVar55._20_2_ = 0xfa8;
  auVar55._22_2_ = 0xfa8;
  auVar55._24_2_ = 0xfa8;
  auVar55._26_2_ = 0xfa8;
  auVar55._28_2_ = 0xfa8;
  auVar55._30_2_ = 0xfa8;
  auVar55 = vpmulhrsw_avx2((undefined1  [32])input[5],auVar55);
  auVar57._8_2_ = 0x7f08;
  auVar57._0_8_ = 0x7f087f087f087f08;
  auVar57._10_2_ = 0x7f08;
  auVar57._12_2_ = 0x7f08;
  auVar57._14_2_ = 0x7f08;
  auVar57._16_2_ = 0x7f08;
  auVar57._18_2_ = 0x7f08;
  auVar57._20_2_ = 0x7f08;
  auVar57._22_2_ = 0x7f08;
  auVar57._24_2_ = 0x7f08;
  auVar57._26_2_ = 0x7f08;
  auVar57._28_2_ = 0x7f08;
  auVar57._30_2_ = 0x7f08;
  auVar66 = vpmulhrsw_avx2((undefined1  [32])input[5],auVar57);
  auVar58._8_2_ = 0xb140;
  auVar58._0_8_ = 0xb140b140b140b140;
  auVar58._10_2_ = 0xb140;
  auVar58._12_2_ = 0xb140;
  auVar58._14_2_ = 0xb140;
  auVar58._16_2_ = 0xb140;
  auVar58._18_2_ = 0xb140;
  auVar58._20_2_ = 0xb140;
  auVar58._22_2_ = 0xb140;
  auVar58._24_2_ = 0xb140;
  auVar58._26_2_ = 0xb140;
  auVar58._28_2_ = 0xb140;
  auVar58._30_2_ = 0xb140;
  auVar57 = vpmulhrsw_avx2((undefined1  [32])input[0x1b],auVar58);
  auVar60._8_2_ = 0x64e8;
  auVar60._0_8_ = 0x64e864e864e864e8;
  auVar60._10_2_ = 0x64e8;
  auVar60._12_2_ = 0x64e8;
  auVar60._14_2_ = 0x64e8;
  auVar60._16_2_ = 0x64e8;
  auVar60._18_2_ = 0x64e8;
  auVar60._20_2_ = 0x64e8;
  auVar60._22_2_ = 0x64e8;
  auVar60._24_2_ = 0x64e8;
  auVar60._26_2_ = 0x64e8;
  auVar60._28_2_ = 0x64e8;
  auVar60._30_2_ = 0x64e8;
  auVar58 = vpmulhrsw_avx2((undefined1  [32])input[0x1b],auVar60);
  auVar72._8_2_ = 0x3f18;
  auVar72._0_8_ = 0x3f183f183f183f18;
  auVar72._10_2_ = 0x3f18;
  auVar72._12_2_ = 0x3f18;
  auVar72._14_2_ = 0x3f18;
  auVar72._16_2_ = 0x3f18;
  auVar72._18_2_ = 0x3f18;
  auVar72._20_2_ = 0x3f18;
  auVar72._22_2_ = 0x3f18;
  auVar72._24_2_ = 0x3f18;
  auVar72._26_2_ = 0x3f18;
  auVar72._28_2_ = 0x3f18;
  auVar72._30_2_ = 0x3f18;
  auVar68 = vpmulhrsw_avx2((undefined1  [32])input[0x15],auVar72);
  auVar61._8_2_ = 0x6f60;
  auVar61._0_8_ = 0x6f606f606f606f60;
  auVar61._10_2_ = 0x6f60;
  auVar61._12_2_ = 0x6f60;
  auVar61._14_2_ = 0x6f60;
  auVar61._16_2_ = 0x6f60;
  auVar61._18_2_ = 0x6f60;
  auVar61._20_2_ = 0x6f60;
  auVar61._22_2_ = 0x6f60;
  auVar61._24_2_ = 0x6f60;
  auVar61._26_2_ = 0x6f60;
  auVar61._28_2_ = 0x6f60;
  auVar61._30_2_ = 0x6f60;
  auVar59 = vpmulhrsw_avx2((undefined1  [32])input[0x15],auVar61);
  auVar73._8_2_ = 0xdde0;
  auVar73._0_8_ = 0xdde0dde0dde0dde0;
  auVar73._10_2_ = 0xdde0;
  auVar73._12_2_ = 0xdde0;
  auVar73._14_2_ = 0xdde0;
  auVar73._16_2_ = 0xdde0;
  auVar73._18_2_ = 0xdde0;
  auVar73._20_2_ = 0xdde0;
  auVar73._22_2_ = 0xdde0;
  auVar73._24_2_ = 0xdde0;
  auVar73._26_2_ = 0xdde0;
  auVar73._28_2_ = 0xdde0;
  auVar73._30_2_ = 0xdde0;
  auVar60 = vpmulhrsw_avx2((undefined1  [32])input[0xb],auVar73);
  auVar62._8_2_ = 0x7b60;
  auVar62._0_8_ = 0x7b607b607b607b60;
  auVar62._10_2_ = 0x7b60;
  auVar62._12_2_ = 0x7b60;
  auVar62._14_2_ = 0x7b60;
  auVar62._16_2_ = 0x7b60;
  auVar62._18_2_ = 0x7b60;
  auVar62._20_2_ = 0x7b60;
  auVar62._22_2_ = 0x7b60;
  auVar62._24_2_ = 0x7b60;
  auVar62._26_2_ = 0x7b60;
  auVar62._28_2_ = 0x7b60;
  auVar62._30_2_ = 0x7b60;
  auVar72 = vpmulhrsw_avx2((undefined1  [32])input[0xb],auVar62);
  auVar11._8_2_ = 0x2828;
  auVar11._0_8_ = 0x2828282828282828;
  auVar11._10_2_ = 0x2828;
  auVar11._12_2_ = 0x2828;
  auVar11._14_2_ = 0x2828;
  auVar11._16_2_ = 0x2828;
  auVar11._18_2_ = 0x2828;
  auVar11._20_2_ = 0x2828;
  auVar11._22_2_ = 0x2828;
  auVar11._24_2_ = 0x2828;
  auVar11._26_2_ = 0x2828;
  auVar11._28_2_ = 0x2828;
  auVar11._30_2_ = 0x2828;
  auVar61 = vpmulhrsw_avx2((undefined1  [32])input[0xd],auVar11);
  auVar12._8_2_ = 0x7988;
  auVar12._0_8_ = 0x7988798879887988;
  auVar12._10_2_ = 0x7988;
  auVar12._12_2_ = 0x7988;
  auVar12._14_2_ = 0x7988;
  auVar12._16_2_ = 0x7988;
  auVar12._18_2_ = 0x7988;
  auVar12._20_2_ = 0x7988;
  auVar12._22_2_ = 0x7988;
  auVar12._24_2_ = 0x7988;
  auVar12._26_2_ = 0x7988;
  auVar12._28_2_ = 0x7988;
  auVar12._30_2_ = 0x7988;
  auVar73 = vpmulhrsw_avx2((undefined1  [32])input[0xd],auVar12);
  auVar13._8_2_ = 0xc670;
  auVar13._0_8_ = 0xc670c670c670c670;
  auVar13._10_2_ = 0xc670;
  auVar13._12_2_ = 0xc670;
  auVar13._14_2_ = 0xc670;
  auVar13._16_2_ = 0xc670;
  auVar13._18_2_ = 0xc670;
  auVar13._20_2_ = 0xc670;
  auVar13._22_2_ = 0xc670;
  auVar13._24_2_ = 0xc670;
  auVar13._26_2_ = 0xc670;
  auVar13._28_2_ = 0xc670;
  auVar13._30_2_ = 0xc670;
  auVar62 = vpmulhrsw_avx2((undefined1  [32])input[0x13],auVar13);
  auVar14._8_2_ = 0x7258;
  auVar14._0_8_ = 0x7258725872587258;
  auVar14._10_2_ = 0x7258;
  auVar14._12_2_ = 0x7258;
  auVar14._14_2_ = 0x7258;
  auVar14._16_2_ = 0x7258;
  auVar14._18_2_ = 0x7258;
  auVar14._20_2_ = 0x7258;
  auVar14._22_2_ = 0x7258;
  auVar14._24_2_ = 0x7258;
  auVar14._26_2_ = 0x7258;
  auVar14._28_2_ = 0x7258;
  auVar14._30_2_ = 0x7258;
  auVar11 = vpmulhrsw_avx2((undefined1  [32])input[0x13],auVar14);
  auVar15._8_2_ = 0x5398;
  auVar15._0_8_ = 0x5398539853985398;
  auVar15._10_2_ = 0x5398;
  auVar15._12_2_ = 0x5398;
  auVar15._14_2_ = 0x5398;
  auVar15._16_2_ = 0x5398;
  auVar15._18_2_ = 0x5398;
  auVar15._20_2_ = 0x5398;
  auVar15._22_2_ = 0x5398;
  auVar15._24_2_ = 0x5398;
  auVar15._26_2_ = 0x5398;
  auVar15._28_2_ = 0x5398;
  auVar15._30_2_ = 0x5398;
  auVar12 = vpmulhrsw_avx2((undefined1  [32])input[0x1d],auVar15);
  auVar16._8_2_ = 0x60f0;
  auVar16._0_8_ = 0x60f060f060f060f0;
  auVar16._10_2_ = 0x60f0;
  auVar16._12_2_ = 0x60f0;
  auVar16._14_2_ = 0x60f0;
  auVar16._16_2_ = 0x60f0;
  auVar16._18_2_ = 0x60f0;
  auVar16._20_2_ = 0x60f0;
  auVar16._22_2_ = 0x60f0;
  auVar16._24_2_ = 0x60f0;
  auVar16._26_2_ = 0x60f0;
  auVar16._28_2_ = 0x60f0;
  auVar16._30_2_ = 0x60f0;
  auVar13 = vpmulhrsw_avx2((undefined1  [32])input[0x1d],auVar16);
  auVar17._8_2_ = 0xf698;
  auVar17._0_8_ = 0xf698f698f698f698;
  auVar17._10_2_ = 0xf698;
  auVar17._12_2_ = 0xf698;
  auVar17._14_2_ = 0xf698;
  auVar17._16_2_ = 0xf698;
  auVar17._18_2_ = 0xf698;
  auVar17._20_2_ = 0xf698;
  auVar17._22_2_ = 0xf698;
  auVar17._24_2_ = 0xf698;
  auVar17._26_2_ = 0xf698;
  auVar17._28_2_ = 0xf698;
  auVar17._30_2_ = 0xf698;
  auVar14 = vpmulhrsw_avx2((undefined1  [32])input[3],auVar17);
  auVar18._8_2_ = 0x7fa8;
  auVar18._0_8_ = 0x7fa87fa87fa87fa8;
  auVar18._10_2_ = 0x7fa8;
  auVar18._12_2_ = 0x7fa8;
  auVar18._14_2_ = 0x7fa8;
  auVar18._16_2_ = 0x7fa8;
  auVar18._18_2_ = 0x7fa8;
  auVar18._20_2_ = 0x7fa8;
  auVar18._22_2_ = 0x7fa8;
  auVar18._24_2_ = 0x7fa8;
  auVar18._26_2_ = 0x7fa8;
  auVar18._28_2_ = 0x7fa8;
  auVar18._30_2_ = 0x7fa8;
  auVar15 = vpmulhrsw_avx2((undefined1  [32])input[3],auVar18);
  auVar19._8_2_ = 0x648;
  auVar19._0_8_ = 0x648064806480648;
  auVar19._10_2_ = 0x648;
  auVar19._12_2_ = 0x648;
  auVar19._14_2_ = 0x648;
  auVar19._16_2_ = 0x648;
  auVar19._18_2_ = 0x648;
  auVar19._20_2_ = 0x648;
  auVar19._22_2_ = 0x648;
  auVar19._24_2_ = 0x648;
  auVar19._26_2_ = 0x648;
  auVar19._28_2_ = 0x648;
  auVar19._30_2_ = 0x648;
  auVar16 = vpmulhrsw_avx2((undefined1  [32])input[2],auVar19);
  auVar20._8_2_ = 0x7fd8;
  auVar20._0_8_ = 0x7fd87fd87fd87fd8;
  auVar20._10_2_ = 0x7fd8;
  auVar20._12_2_ = 0x7fd8;
  auVar20._14_2_ = 0x7fd8;
  auVar20._16_2_ = 0x7fd8;
  auVar20._18_2_ = 0x7fd8;
  auVar20._20_2_ = 0x7fd8;
  auVar20._22_2_ = 0x7fd8;
  auVar20._24_2_ = 0x7fd8;
  auVar20._26_2_ = 0x7fd8;
  auVar20._28_2_ = 0x7fd8;
  auVar20._30_2_ = 0x7fd8;
  auVar17 = vpmulhrsw_avx2((undefined1  [32])input[2],auVar20);
  auVar21._8_2_ = 0xaa08;
  auVar21._0_8_ = 0xaa08aa08aa08aa08;
  auVar21._10_2_ = 0xaa08;
  auVar21._12_2_ = 0xaa08;
  auVar21._14_2_ = 0xaa08;
  auVar21._16_2_ = 0xaa08;
  auVar21._18_2_ = 0xaa08;
  auVar21._20_2_ = 0xaa08;
  auVar21._22_2_ = 0xaa08;
  auVar21._24_2_ = 0xaa08;
  auVar21._26_2_ = 0xaa08;
  auVar21._28_2_ = 0xaa08;
  auVar21._30_2_ = 0xaa08;
  auVar18 = vpmulhrsw_avx2((undefined1  [32])input[0x1e],auVar21);
  auVar22._8_2_ = 0x5ed8;
  auVar22._0_8_ = 0x5ed85ed85ed85ed8;
  auVar22._10_2_ = 0x5ed8;
  auVar22._12_2_ = 0x5ed8;
  auVar22._14_2_ = 0x5ed8;
  auVar22._16_2_ = 0x5ed8;
  auVar22._18_2_ = 0x5ed8;
  auVar22._20_2_ = 0x5ed8;
  auVar22._22_2_ = 0x5ed8;
  auVar22._24_2_ = 0x5ed8;
  auVar22._26_2_ = 0x5ed8;
  auVar22._28_2_ = 0x5ed8;
  auVar22._30_2_ = 0x5ed8;
  auVar19 = vpmulhrsw_avx2((undefined1  [32])input[0x1e],auVar22);
  auVar23._8_2_ = 0x36b8;
  auVar23._0_8_ = 0x36b836b836b836b8;
  auVar23._10_2_ = 0x36b8;
  auVar23._12_2_ = 0x36b8;
  auVar23._14_2_ = 0x36b8;
  auVar23._16_2_ = 0x36b8;
  auVar23._18_2_ = 0x36b8;
  auVar23._20_2_ = 0x36b8;
  auVar23._22_2_ = 0x36b8;
  auVar23._24_2_ = 0x36b8;
  auVar23._26_2_ = 0x36b8;
  auVar23._28_2_ = 0x36b8;
  auVar23._30_2_ = 0x36b8;
  auVar20 = vpmulhrsw_avx2((undefined1  [32])alVar84,auVar23);
  auVar24._8_2_ = 0x73b8;
  auVar24._0_8_ = 0x73b873b873b873b8;
  auVar24._10_2_ = 0x73b8;
  auVar24._12_2_ = 0x73b8;
  auVar24._14_2_ = 0x73b8;
  auVar24._16_2_ = 0x73b8;
  auVar24._18_2_ = 0x73b8;
  auVar24._20_2_ = 0x73b8;
  auVar24._22_2_ = 0x73b8;
  auVar24._24_2_ = 0x73b8;
  auVar24._26_2_ = 0x73b8;
  auVar24._28_2_ = 0x73b8;
  auVar24._30_2_ = 0x73b8;
  auVar21 = vpmulhrsw_avx2((undefined1  [32])alVar84,auVar24);
  auVar25._8_2_ = 0xd4e0;
  auVar25._0_8_ = 0xd4e0d4e0d4e0d4e0;
  auVar25._10_2_ = 0xd4e0;
  auVar25._12_2_ = 0xd4e0;
  auVar25._14_2_ = 0xd4e0;
  auVar25._16_2_ = 0xd4e0;
  auVar25._18_2_ = 0xd4e0;
  auVar25._20_2_ = 0xd4e0;
  auVar25._22_2_ = 0xd4e0;
  auVar25._24_2_ = 0xd4e0;
  auVar25._26_2_ = 0xd4e0;
  auVar25._28_2_ = 0xd4e0;
  auVar25._30_2_ = 0xd4e0;
  auVar22 = vpmulhrsw_avx2((undefined1  [32])input[0xe],auVar25);
  auVar26._8_2_ = 0x7888;
  auVar26._0_8_ = 0x7888788878887888;
  auVar26._10_2_ = 0x7888;
  auVar26._12_2_ = 0x7888;
  auVar26._14_2_ = 0x7888;
  auVar26._16_2_ = 0x7888;
  auVar26._18_2_ = 0x7888;
  auVar26._20_2_ = 0x7888;
  auVar26._22_2_ = 0x7888;
  auVar26._24_2_ = 0x7888;
  auVar26._26_2_ = 0x7888;
  auVar26._28_2_ = 0x7888;
  auVar26._30_2_ = 0x7888;
  auVar23 = vpmulhrsw_avx2((undefined1  [32])input[0xe],auVar26);
  auVar27._8_2_ = 0x1f18;
  auVar27._0_8_ = 0x1f181f181f181f18;
  auVar27._10_2_ = 0x1f18;
  auVar27._12_2_ = 0x1f18;
  auVar27._14_2_ = 0x1f18;
  auVar27._16_2_ = 0x1f18;
  auVar27._18_2_ = 0x1f18;
  auVar27._20_2_ = 0x1f18;
  auVar27._22_2_ = 0x1f18;
  auVar27._24_2_ = 0x1f18;
  auVar27._26_2_ = 0x1f18;
  auVar27._28_2_ = 0x1f18;
  auVar27._30_2_ = 0x1f18;
  auVar24 = vpmulhrsw_avx2((undefined1  [32])input[10],auVar27);
  auVar28._8_2_ = 0x7c28;
  auVar28._0_8_ = 0x7c287c287c287c28;
  auVar28._10_2_ = 0x7c28;
  auVar28._12_2_ = 0x7c28;
  auVar28._14_2_ = 0x7c28;
  auVar28._16_2_ = 0x7c28;
  auVar28._18_2_ = 0x7c28;
  auVar28._20_2_ = 0x7c28;
  auVar28._22_2_ = 0x7c28;
  auVar28._24_2_ = 0x7c28;
  auVar28._26_2_ = 0x7c28;
  auVar28._28_2_ = 0x7c28;
  auVar28._30_2_ = 0x7c28;
  auVar25 = vpmulhrsw_avx2((undefined1  [32])input[10],auVar28);
  auVar29._8_2_ = 0xbe30;
  auVar29._0_8_ = 0xbe30be30be30be30;
  auVar29._10_2_ = 0xbe30;
  auVar29._12_2_ = 0xbe30;
  auVar29._14_2_ = 0xbe30;
  auVar29._16_2_ = 0xbe30;
  auVar29._18_2_ = 0xbe30;
  auVar29._20_2_ = 0xbe30;
  auVar29._22_2_ = 0xbe30;
  auVar29._24_2_ = 0xbe30;
  auVar29._26_2_ = 0xbe30;
  auVar29._28_2_ = 0xbe30;
  auVar29._30_2_ = 0xbe30;
  auVar39._8_2_ = 0x6dc8;
  auVar39._0_8_ = 0x6dc86dc86dc86dc8;
  auVar39._10_2_ = 0x6dc8;
  auVar39._12_2_ = 0x6dc8;
  auVar39._14_2_ = 0x6dc8;
  auVar39._16_2_ = 0x6dc8;
  auVar39._18_2_ = 0x6dc8;
  auVar39._20_2_ = 0x6dc8;
  auVar39._22_2_ = 0x6dc8;
  auVar39._24_2_ = 0x6dc8;
  auVar39._26_2_ = 0x6dc8;
  auVar39._28_2_ = 0x6dc8;
  auVar39._30_2_ = 0x6dc8;
  auVar26 = vpmulhrsw_avx2((undefined1  [32])input[0x16],auVar29);
  auVar27 = vpmulhrsw_avx2((undefined1  [32])input[0x16],auVar39);
  auVar30._8_2_ = 0x4c40;
  auVar30._0_8_ = 0x4c404c404c404c40;
  auVar30._10_2_ = 0x4c40;
  auVar30._12_2_ = 0x4c40;
  auVar30._14_2_ = 0x4c40;
  auVar30._16_2_ = 0x4c40;
  auVar30._18_2_ = 0x4c40;
  auVar30._20_2_ = 0x4c40;
  auVar30._22_2_ = 0x4c40;
  auVar30._24_2_ = 0x4c40;
  auVar30._26_2_ = 0x4c40;
  auVar30._28_2_ = 0x4c40;
  auVar30._30_2_ = 0x4c40;
  auVar40._8_2_ = 0x66d0;
  auVar40._0_8_ = 0x66d066d066d066d0;
  auVar40._10_2_ = 0x66d0;
  auVar40._12_2_ = 0x66d0;
  auVar40._14_2_ = 0x66d0;
  auVar40._16_2_ = 0x66d0;
  auVar40._18_2_ = 0x66d0;
  auVar40._20_2_ = 0x66d0;
  auVar40._22_2_ = 0x66d0;
  auVar40._24_2_ = 0x66d0;
  auVar40._26_2_ = 0x66d0;
  auVar40._28_2_ = 0x66d0;
  auVar40._30_2_ = 0x66d0;
  auVar1._12_4_ = uStack_a74;
  auVar1._0_12_ = *(undefined1 (*) [12])input[0x1a];
  auVar1._16_4_ = uStack_a70;
  auVar1._20_4_ = uStack_a6c;
  auVar1._24_4_ = uStack_a68;
  auVar1._28_4_ = uStack_a64;
  auVar28 = vpmulhrsw_avx2(auVar1,auVar30);
  auVar1 = vpmulhrsw_avx2(auVar1,auVar40);
  auVar31._8_2_ = 0xed38;
  auVar31._0_8_ = 0xed38ed38ed38ed38;
  auVar31._10_2_ = 0xed38;
  auVar31._12_2_ = 0xed38;
  auVar31._14_2_ = 0xed38;
  auVar31._16_2_ = 0xed38;
  auVar31._18_2_ = 0xed38;
  auVar31._20_2_ = 0xed38;
  auVar31._22_2_ = 0xed38;
  auVar31._24_2_ = 0xed38;
  auVar31._26_2_ = 0xed38;
  auVar31._28_2_ = 0xed38;
  auVar31._30_2_ = 0xed38;
  auVar41._8_2_ = 0x7ea0;
  auVar41._0_8_ = 0x7ea07ea07ea07ea0;
  auVar41._10_2_ = 0x7ea0;
  auVar41._12_2_ = 0x7ea0;
  auVar41._14_2_ = 0x7ea0;
  auVar41._16_2_ = 0x7ea0;
  auVar41._18_2_ = 0x7ea0;
  auVar41._20_2_ = 0x7ea0;
  auVar41._22_2_ = 0x7ea0;
  auVar41._24_2_ = 0x7ea0;
  auVar41._26_2_ = 0x7ea0;
  auVar41._28_2_ = 0x7ea0;
  auVar41._30_2_ = 0x7ea0;
  auVar2._12_4_ = uStack_a54;
  auVar2._0_12_ = *(undefined1 (*) [12])input[6];
  auVar2._16_4_ = uStack_a50;
  auVar2._20_4_ = uStack_a4c;
  auVar2._24_4_ = uStack_a48;
  auVar2._28_4_ = uStack_a44;
  auVar29 = vpmulhrsw_avx2(auVar2,auVar31);
  auVar2 = vpmulhrsw_avx2(auVar2,auVar41);
  local_460 = vpaddsw_avx2(auVar63,auVar52);
  alVar84[0]._0_4_ = 0xec8;
  local_440 = vpsubsw_avx2(auVar63,auVar52);
  local_e80._8_4_ = 0x61ff138;
  local_e80._0_8_ = 0x61ff138061ff138;
  local_e80._12_4_ = 0x61ff138;
  local_e80._16_4_ = 0x61ff138;
  local_e80._20_4_ = 0x61ff138;
  local_e80._24_4_ = 0x61ff138;
  local_e80._28_4_ = 0x61ff138;
  local_400 = vpaddsw_avx2(auVar65,auVar70);
  local_420 = vpsubsw_avx2(auVar65,auVar70);
  local_3e0 = vpaddsw_avx2(auVar78,auVar79);
  local_3c0 = vpsubsw_avx2(auVar78,auVar79);
  local_380 = vpaddsw_avx2(auVar54,auVar81);
  local_3a0 = vpsubsw_avx2(auVar54,auVar81);
  local_360 = vpaddsw_avx2(auVar55,auVar57);
  local_340 = vpsubsw_avx2(auVar55,auVar57);
  local_300 = vpaddsw_avx2(auVar60,auVar68);
  local_320 = vpsubsw_avx2(auVar60,auVar68);
  local_2e0 = vpaddsw_avx2(auVar61,auVar62);
  local_2c0 = vpsubsw_avx2(auVar61,auVar62);
  local_280 = vpaddsw_avx2(auVar14,auVar12);
  local_2a0 = vpsubsw_avx2(auVar14,auVar12);
  local_260 = vpaddsw_avx2(auVar15,auVar13);
  local_240 = vpsubsw_avx2(auVar15,auVar13);
  local_200 = vpaddsw_avx2(auVar73,auVar11);
  local_220 = vpsubsw_avx2(auVar73,auVar11);
  local_1e0 = vpaddsw_avx2(auVar72,auVar59);
  local_1c0 = vpsubsw_avx2(auVar72,auVar59);
  local_180 = vpaddsw_avx2(auVar66,auVar58);
  local_1a0 = vpsubsw_avx2(auVar66,auVar58);
  local_160 = vpaddsw_avx2(auVar50,auVar67);
  local_140 = vpsubsw_avx2(auVar50,auVar67);
  local_100 = vpaddsw_avx2(auVar49,auVar83);
  local_120 = vpsubsw_avx2(auVar49,auVar83);
  local_e0 = vpaddsw_avx2(auVar64,auVar53);
  local_c0 = vpsubsw_avx2(auVar64,auVar53);
  local_80 = vpaddsw_avx2(auVar69,auVar51);
  local_a0 = vpsubsw_avx2(auVar69,auVar51);
  auVar63._8_2_ = 0xc88;
  auVar63._0_8_ = 0xc880c880c880c88;
  auVar63._10_2_ = 0xc88;
  auVar63._12_2_ = 0xc88;
  auVar63._14_2_ = 0xc88;
  auVar63._16_2_ = 0xc88;
  auVar63._18_2_ = 0xc88;
  auVar63._20_2_ = 0xc88;
  auVar63._22_2_ = 0xc88;
  auVar63._24_2_ = 0xc88;
  auVar63._26_2_ = 0xc88;
  auVar63._28_2_ = 0xc88;
  auVar63._30_2_ = 0xc88;
  auVar42._8_2_ = 0x7f60;
  auVar42._0_8_ = 0x7f607f607f607f60;
  auVar42._10_2_ = 0x7f60;
  auVar42._12_2_ = 0x7f60;
  auVar42._14_2_ = 0x7f60;
  auVar42._16_2_ = 0x7f60;
  auVar42._18_2_ = 0x7f60;
  auVar42._20_2_ = 0x7f60;
  auVar42._22_2_ = 0x7f60;
  auVar42._24_2_ = 0x7f60;
  auVar42._26_2_ = 0x7f60;
  auVar42._28_2_ = 0x7f60;
  auVar42._30_2_ = 0x7f60;
  local_760 = vpmulhrsw_avx2((undefined1  [32])input[4],auVar63);
  local_680 = vpmulhrsw_avx2((undefined1  [32])input[4],auVar42);
  auVar32._8_2_ = 0xaed0;
  auVar32._0_8_ = 0xaed0aed0aed0aed0;
  auVar32._10_2_ = 0xaed0;
  auVar32._12_2_ = 0xaed0;
  auVar32._14_2_ = 0xaed0;
  auVar32._16_2_ = 0xaed0;
  auVar32._18_2_ = 0xaed0;
  auVar32._20_2_ = 0xaed0;
  auVar32._22_2_ = 0xaed0;
  auVar32._24_2_ = 0xaed0;
  auVar32._26_2_ = 0xaed0;
  auVar32._28_2_ = 0xaed0;
  auVar32._30_2_ = 0xaed0;
  auVar43._8_2_ = 0x62f0;
  auVar43._0_8_ = 0x62f062f062f062f0;
  auVar43._10_2_ = 0x62f0;
  auVar43._12_2_ = 0x62f0;
  auVar43._14_2_ = 0x62f0;
  auVar43._16_2_ = 0x62f0;
  auVar43._18_2_ = 0x62f0;
  auVar43._20_2_ = 0x62f0;
  auVar43._22_2_ = 0x62f0;
  auVar43._24_2_ = 0x62f0;
  auVar43._26_2_ = 0x62f0;
  auVar43._28_2_ = 0x62f0;
  auVar43._30_2_ = 0x62f0;
  local_740 = vpmulhrsw_avx2((undefined1  [32])input[0x1c],auVar32);
  local_6a0 = vpmulhrsw_avx2((undefined1  [32])input[0x1c],auVar43);
  auVar33._8_2_ = 0x3c58;
  auVar33._0_8_ = 0x3c583c583c583c58;
  auVar33._10_2_ = 0x3c58;
  auVar33._12_2_ = 0x3c58;
  auVar33._14_2_ = 0x3c58;
  auVar33._16_2_ = 0x3c58;
  auVar33._18_2_ = 0x3c58;
  auVar33._20_2_ = 0x3c58;
  auVar33._22_2_ = 0x3c58;
  auVar33._24_2_ = 0x3c58;
  auVar33._26_2_ = 0x3c58;
  auVar33._28_2_ = 0x3c58;
  auVar33._30_2_ = 0x3c58;
  auVar44._8_2_ = 0x70e0;
  auVar44._0_8_ = 0x70e070e070e070e0;
  auVar44._10_2_ = 0x70e0;
  auVar44._12_2_ = 0x70e0;
  auVar44._14_2_ = 0x70e0;
  auVar44._16_2_ = 0x70e0;
  auVar44._18_2_ = 0x70e0;
  auVar44._20_2_ = 0x70e0;
  auVar44._22_2_ = 0x70e0;
  auVar44._24_2_ = 0x70e0;
  auVar44._26_2_ = 0x70e0;
  auVar44._28_2_ = 0x70e0;
  auVar44._30_2_ = 0x70e0;
  local_720 = vpmulhrsw_avx2((undefined1  [32])input[0x14],auVar33);
  local_6c0 = vpmulhrsw_avx2((undefined1  [32])input[0x14],auVar44);
  auVar34._8_2_ = 0xdad8;
  auVar34._0_8_ = 0xdad8dad8dad8dad8;
  auVar34._10_2_ = 0xdad8;
  auVar34._12_2_ = 0xdad8;
  auVar34._14_2_ = 0xdad8;
  auVar34._16_2_ = 0xdad8;
  auVar34._18_2_ = 0xdad8;
  auVar34._20_2_ = 0xdad8;
  auVar34._22_2_ = 0xdad8;
  auVar34._24_2_ = 0xdad8;
  auVar34._26_2_ = 0xdad8;
  auVar34._28_2_ = 0xdad8;
  auVar34._30_2_ = 0xdad8;
  auVar45._8_2_ = 0x7a80;
  auVar45._0_8_ = 0x7a807a807a807a80;
  auVar45._10_2_ = 0x7a80;
  auVar45._12_2_ = 0x7a80;
  auVar45._14_2_ = 0x7a80;
  auVar45._16_2_ = 0x7a80;
  auVar45._18_2_ = 0x7a80;
  auVar45._20_2_ = 0x7a80;
  auVar45._22_2_ = 0x7a80;
  auVar45._24_2_ = 0x7a80;
  auVar45._26_2_ = 0x7a80;
  auVar45._28_2_ = 0x7a80;
  auVar45._30_2_ = 0x7a80;
  local_700 = vpmulhrsw_avx2((undefined1  [32])input[0xc],auVar34);
  local_6e0 = vpmulhrsw_avx2((undefined1  [32])input[0xc],auVar45);
  local_660 = vpaddsw_avx2(auVar16,auVar18);
  local_640 = vpsubsw_avx2(auVar16,auVar18);
  local_600 = vpaddsw_avx2(auVar22,auVar20);
  local_620 = vpsubsw_avx2(auVar22,auVar20);
  local_5e0 = vpaddsw_avx2(auVar24,auVar26);
  local_5c0 = vpsubsw_avx2(auVar24,auVar26);
  local_580 = vpaddsw_avx2(auVar29,auVar28);
  local_5a0 = vpsubsw_avx2(auVar29,auVar28);
  local_560 = vpaddsw_avx2(auVar2,auVar1);
  local_540 = vpsubsw_avx2(auVar2,auVar1);
  local_500 = vpaddsw_avx2(auVar25,auVar27);
  local_520 = vpsubsw_avx2(auVar25,auVar27);
  local_4e0 = vpaddsw_avx2(auVar23,auVar21);
  local_4c0 = vpsubsw_avx2(auVar23,auVar21);
  local_480 = vpaddsw_avx2(auVar17,auVar19);
  local_12a0._8_4_ = 0xec8061f;
  local_12a0._0_8_ = 0xec8061f0ec8061f;
  local_12a0._12_4_ = 0xec8061f;
  local_12a0._16_4_ = 0xec8061f;
  local_12a0._20_4_ = 0xec8061f;
  local_12a0._24_4_ = 0xec8061f;
  local_12a0._28_4_ = 0xec8061f;
  local_4a0 = vpsubsw_avx2(auVar17,auVar19);
  local_1280._8_4_ = 0xf138f9e1;
  local_1280._0_8_ = 0xf138f9e1f138f9e1;
  local_1280._12_4_ = 0xf138f9e1;
  local_1280._16_4_ = 0xf138f9e1;
  local_1280._20_4_ = 0xf138f9e1;
  local_1280._24_4_ = 0xf138f9e1;
  local_1280._28_4_ = 0xf138f9e1;
  idct64_stage4_high32_avx2(local_860,(int32_t *)0xffff,alVar84,'\0');
  auVar35._8_2_ = 0x18f8;
  auVar35._0_8_ = 0x18f818f818f818f8;
  auVar35._10_2_ = 0x18f8;
  auVar35._12_2_ = 0x18f8;
  auVar35._14_2_ = 0x18f8;
  auVar35._16_2_ = 0x18f8;
  auVar35._18_2_ = 0x18f8;
  auVar35._20_2_ = 0x18f8;
  auVar35._22_2_ = 0x18f8;
  auVar35._24_2_ = 0x18f8;
  auVar35._26_2_ = 0x18f8;
  auVar35._28_2_ = 0x18f8;
  auVar35._30_2_ = 0x18f8;
  auVar46._8_2_ = 0x7d88;
  auVar46._0_8_ = 0x7d887d887d887d88;
  auVar46._10_2_ = 0x7d88;
  auVar46._12_2_ = 0x7d88;
  auVar46._14_2_ = 0x7d88;
  auVar46._16_2_ = 0x7d88;
  auVar46._18_2_ = 0x7d88;
  auVar46._20_2_ = 0x7d88;
  auVar46._22_2_ = 0x7d88;
  auVar46._24_2_ = 0x7d88;
  auVar46._26_2_ = 0x7d88;
  auVar46._28_2_ = 0x7d88;
  auVar46._30_2_ = 0x7d88;
  auVar49 = vpmulhrsw_avx2((undefined1  [32])local_7e0,auVar35);
  auVar79 = vpmulhrsw_avx2((undefined1  [32])local_7e0,auVar46);
  auVar36._8_2_ = 0xb8e0;
  auVar36._0_8_ = 0xb8e0b8e0b8e0b8e0;
  auVar36._10_2_ = 0xb8e0;
  auVar36._12_2_ = 0xb8e0;
  auVar36._14_2_ = 0xb8e0;
  auVar36._16_2_ = 0xb8e0;
  auVar36._18_2_ = 0xb8e0;
  auVar36._20_2_ = 0xb8e0;
  auVar36._22_2_ = 0xb8e0;
  auVar36._24_2_ = 0xb8e0;
  auVar36._26_2_ = 0xb8e0;
  auVar36._28_2_ = 0xb8e0;
  auVar36._30_2_ = 0xb8e0;
  auVar47._8_2_ = 0x6a70;
  auVar47._0_8_ = 0x6a706a706a706a70;
  auVar47._10_2_ = 0x6a70;
  auVar47._12_2_ = 0x6a70;
  auVar47._14_2_ = 0x6a70;
  auVar47._16_2_ = 0x6a70;
  auVar47._18_2_ = 0x6a70;
  auVar47._20_2_ = 0x6a70;
  auVar47._22_2_ = 0x6a70;
  auVar47._24_2_ = 0x6a70;
  auVar47._26_2_ = 0x6a70;
  auVar47._28_2_ = 0x6a70;
  auVar47._30_2_ = 0x6a70;
  auVar83 = vpmulhrsw_avx2((undefined1  [32])local_7a0,auVar36);
  auVar81 = vpmulhrsw_avx2((undefined1  [32])local_7a0,auVar47);
  auVar72 = vpaddsw_avx2(local_760,local_740);
  auVar67 = vpsubsw_avx2(local_760,local_740);
  auVar61 = vpaddsw_avx2(local_700,local_720);
  auVar54 = vpsubsw_avx2(local_700,local_720);
  auVar73 = vpaddsw_avx2(local_6e0,local_6c0);
  auVar50 = vpsubsw_avx2(local_6e0,local_6c0);
  auVar62 = vpaddsw_avx2(local_680,local_6a0);
  auVar55 = vpsubsw_avx2(local_680,local_6a0);
  auVar51 = vpunpcklwd_avx2(local_640,local_4a0);
  auVar52 = vpunpckhwd_avx2(local_640,local_4a0);
  auVar56._8_4_ = 0x31ff04f;
  auVar56._0_8_ = 0x31ff04f031ff04f;
  auVar56._12_4_ = 0x31ff04f;
  auVar56._16_4_ = 0x31ff04f;
  auVar56._20_4_ = 0x31ff04f;
  auVar56._24_4_ = 0x31ff04f;
  auVar56._28_4_ = 0x31ff04f;
  auVar37._8_4_ = 0x800;
  auVar37._0_8_ = 0x80000000800;
  auVar37._12_4_ = 0x800;
  auVar37._16_4_ = 0x800;
  auVar37._20_4_ = 0x800;
  auVar37._24_4_ = 0x800;
  auVar37._28_4_ = 0x800;
  auVar63 = vpmaddwd_avx2(auVar51,auVar56);
  auVar63 = vpaddd_avx2(auVar63,auVar37);
  auVar69 = vpmaddwd_avx2(auVar52,auVar56);
  auVar69 = vpaddd_avx2(auVar69,auVar37);
  auVar63 = vpsrad_avx2(auVar63,0xc);
  auVar69 = vpsrad_avx2(auVar69,0xc);
  auVar63 = vpackssdw_avx2(auVar63,auVar69);
  auVar77._8_4_ = 0xfb1031f;
  auVar77._0_8_ = 0xfb1031f0fb1031f;
  auVar77._12_4_ = 0xfb1031f;
  auVar77._16_4_ = 0xfb1031f;
  auVar77._20_4_ = 0xfb1031f;
  auVar77._24_4_ = 0xfb1031f;
  auVar77._28_4_ = 0xfb1031f;
  auVar69 = vpmaddwd_avx2(auVar77,auVar51);
  auVar52 = vpmaddwd_avx2(auVar77,auVar52);
  auVar69 = vpaddd_avx2(auVar69,auVar37);
  auVar52 = vpaddd_avx2(auVar52,auVar37);
  auVar51 = vpsrad_avx2(auVar69,0xc);
  auVar69 = vpsrad_avx2(auVar52,0xc);
  auVar69 = vpackssdw_avx2(auVar51,auVar69);
  auVar53 = vpunpcklwd_avx2(local_620,local_4c0);
  auVar70 = vpunpckhwd_avx2(local_620,local_4c0);
  auVar76._8_4_ = 0xf04ffce1;
  auVar76._0_8_ = 0xf04ffce1f04ffce1;
  auVar76._12_4_ = 0xf04ffce1;
  auVar76._16_4_ = 0xf04ffce1;
  auVar76._20_4_ = 0xf04ffce1;
  auVar76._24_4_ = 0xf04ffce1;
  auVar76._28_4_ = 0xf04ffce1;
  auVar52 = vpmaddwd_avx2(auVar76,auVar53);
  auVar52 = vpaddd_avx2(auVar52,auVar37);
  auVar51 = vpmaddwd_avx2(auVar76,auVar70);
  auVar51 = vpaddd_avx2(auVar51,auVar37);
  auVar52 = vpsrad_avx2(auVar52,0xc);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar52 = vpackssdw_avx2(auVar52,auVar51);
  auVar51 = vpmaddwd_avx2(auVar53,auVar56);
  auVar70 = vpmaddwd_avx2(auVar70,auVar56);
  auVar51 = vpaddd_avx2(auVar51,auVar37);
  auVar70 = vpaddd_avx2(auVar70,auVar37);
  auVar53 = vpsrad_avx2(auVar51,0xc);
  auVar51 = vpsrad_avx2(auVar70,0xc);
  auVar51 = vpackssdw_avx2(auVar53,auVar51);
  auVar64 = vpunpcklwd_avx2(local_5c0,local_520);
  auVar65 = vpunpckhwd_avx2(local_5c0,local_520);
  auVar74._8_4_ = 0xd4ef71c;
  auVar74._0_8_ = 0xd4ef71c0d4ef71c;
  auVar74._12_4_ = 0xd4ef71c;
  auVar74._16_4_ = 0xd4ef71c;
  auVar74._20_4_ = 0xd4ef71c;
  auVar74._24_4_ = 0xd4ef71c;
  auVar74._28_4_ = 0xd4ef71c;
  auVar70 = vpmaddwd_avx2(auVar64,auVar74);
  auVar70 = vpaddd_avx2(auVar70,auVar37);
  auVar53 = vpmaddwd_avx2(auVar65,auVar74);
  auVar53 = vpaddd_avx2(auVar53,auVar37);
  auVar70 = vpsrad_avx2(auVar70,0xc);
  auVar53 = vpsrad_avx2(auVar53,0xc);
  auVar70 = vpackssdw_avx2(auVar70,auVar53);
  auVar71._8_4_ = 0x8e40d4e;
  auVar71._0_8_ = 0x8e40d4e08e40d4e;
  auVar71._12_4_ = 0x8e40d4e;
  auVar71._16_4_ = 0x8e40d4e;
  auVar71._20_4_ = 0x8e40d4e;
  auVar71._24_4_ = 0x8e40d4e;
  auVar71._28_4_ = 0x8e40d4e;
  auVar53 = vpmaddwd_avx2(auVar64,auVar71);
  auVar65 = vpmaddwd_avx2(auVar65,auVar71);
  auVar53 = vpaddd_avx2(auVar53,auVar37);
  auVar65 = vpaddd_avx2(auVar65,auVar37);
  auVar64 = vpsrad_avx2(auVar53,0xc);
  auVar53 = vpsrad_avx2(auVar65,0xc);
  auVar53 = vpackssdw_avx2(auVar64,auVar53);
  auVar66 = vpunpcklwd_avx2(local_5a0,local_540);
  auVar78 = vpunpckhwd_avx2(local_5a0,local_540);
  auVar48._8_4_ = 0xf71cf2b2;
  auVar48._0_8_ = 0xf71cf2b2f71cf2b2;
  auVar48._12_4_ = 0xf71cf2b2;
  auVar48._16_4_ = 0xf71cf2b2;
  auVar48._20_4_ = 0xf71cf2b2;
  auVar48._24_4_ = 0xf71cf2b2;
  auVar48._28_4_ = 0xf71cf2b2;
  auVar65 = vpmaddwd_avx2(auVar66,auVar48);
  auVar65 = vpaddd_avx2(auVar65,auVar37);
  auVar64 = vpmaddwd_avx2(auVar78,auVar48);
  auVar64 = vpaddd_avx2(auVar64,auVar37);
  auVar65 = vpsrad_avx2(auVar65,0xc);
  auVar64 = vpsrad_avx2(auVar64,0xc);
  auVar65 = vpackssdw_avx2(auVar65,auVar64);
  auVar64 = vpmaddwd_avx2(auVar66,auVar74);
  auVar78 = vpmaddwd_avx2(auVar78,auVar74);
  auVar64 = vpaddd_avx2(auVar64,auVar37);
  auVar78 = vpaddd_avx2(auVar78,auVar37);
  auVar66 = vpsrad_avx2(auVar64,0xc);
  auVar64 = vpsrad_avx2(auVar78,0xc);
  auVar64 = vpackssdw_avx2(auVar66,auVar64);
  auVar11 = vpaddsw_avx2(local_460,local_400);
  auVar66 = vpsubsw_avx2(local_460,local_400);
  auVar12 = vpaddsw_avx2(local_440,local_420);
  auVar57 = vpsubsw_avx2(local_440,local_420);
  auVar13 = vpaddsw_avx2(local_380,local_3e0);
  auVar58 = vpsubsw_avx2(local_380,local_3e0);
  auVar14 = vpaddsw_avx2(local_3a0,local_3c0);
  auVar68 = vpsubsw_avx2(local_3a0,local_3c0);
  auVar15 = vpaddsw_avx2(local_360,local_300);
  auVar59 = vpsubsw_avx2(local_360,local_300);
  auVar16 = vpaddsw_avx2(local_340,local_320);
  auVar35 = vpsubsw_avx2(local_340,local_320);
  auVar17 = vpaddsw_avx2(local_280,local_2e0);
  auVar3 = vpsubsw_avx2(local_280,local_2e0);
  auVar18 = vpaddsw_avx2(local_2a0,local_2c0);
  auVar39 = vpsubsw_avx2(local_2a0,local_2c0);
  auVar19 = vpaddsw_avx2(local_260,local_200);
  auVar40 = vpsubsw_avx2(local_260,local_200);
  auVar20 = vpaddsw_avx2(local_240,local_220);
  auVar41 = vpsubsw_avx2(local_240,local_220);
  auVar21 = vpaddsw_avx2(local_180,local_1e0);
  auVar42 = vpsubsw_avx2(local_180,local_1e0);
  auVar22 = vpaddsw_avx2(local_1a0,local_1c0);
  auVar43 = vpsubsw_avx2(local_1a0,local_1c0);
  auVar23 = vpaddsw_avx2(local_160,local_100);
  auVar44 = vpsubsw_avx2(local_160,local_100);
  auVar24 = vpaddsw_avx2(local_120,local_140);
  auVar45 = vpsubsw_avx2(local_140,local_120);
  auVar25 = vpaddsw_avx2(local_e0,local_80);
  auVar46 = vpsubsw_avx2(local_80,local_e0);
  auVar26 = vpaddsw_avx2(local_c0,local_a0);
  auVar47 = vpsubsw_avx2(local_a0,local_c0);
  auVar75._8_2_ = 0x5a80;
  auVar75._0_8_ = 0x5a805a805a805a80;
  auVar75._10_2_ = 0x5a80;
  auVar75._12_2_ = 0x5a80;
  auVar75._14_2_ = 0x5a80;
  auVar75._16_2_ = 0x5a80;
  auVar75._18_2_ = 0x5a80;
  auVar75._20_2_ = 0x5a80;
  auVar75._22_2_ = 0x5a80;
  auVar75._24_2_ = 0x5a80;
  auVar75._26_2_ = 0x5a80;
  auVar75._28_2_ = 0x5a80;
  auVar75._30_2_ = 0x5a80;
  auVar60 = vpmulhrsw_avx2(auVar75,(undefined1  [32])local_860[0]);
  auVar80._8_2_ = 0x30f8;
  auVar80._0_8_ = 0x30f830f830f830f8;
  auVar80._10_2_ = 0x30f8;
  auVar80._12_2_ = 0x30f8;
  auVar80._14_2_ = 0x30f8;
  auVar80._16_2_ = 0x30f8;
  auVar80._18_2_ = 0x30f8;
  auVar80._20_2_ = 0x30f8;
  auVar80._22_2_ = 0x30f8;
  auVar80._24_2_ = 0x30f8;
  auVar80._26_2_ = 0x30f8;
  auVar80._28_2_ = 0x30f8;
  auVar80._30_2_ = 0x30f8;
  auVar82._0_2_ = (undefined2)((int)alVar84[0] << 3);
  auVar82._2_2_ = auVar82._0_2_;
  auVar82._4_2_ = auVar82._0_2_;
  auVar82._6_2_ = auVar82._0_2_;
  auVar82._8_2_ = auVar82._0_2_;
  auVar82._10_2_ = auVar82._0_2_;
  auVar82._12_2_ = auVar82._0_2_;
  auVar82._14_2_ = auVar82._0_2_;
  auVar82._16_2_ = auVar82._0_2_;
  auVar82._18_2_ = auVar82._0_2_;
  auVar82._20_2_ = auVar82._0_2_;
  auVar82._22_2_ = auVar82._0_2_;
  auVar82._24_2_ = auVar82._0_2_;
  auVar82._26_2_ = auVar82._0_2_;
  auVar82._28_2_ = auVar82._0_2_;
  auVar82._30_2_ = auVar82._0_2_;
  auVar38 = vpmulhrsw_avx2((undefined1  [32])local_820,auVar80);
  auVar36 = vpmulhrsw_avx2((undefined1  [32])local_820,auVar82);
  auVar27 = vpaddsw_avx2(auVar83,auVar49);
  auVar75 = vpsubsw_avx2(auVar49,auVar83);
  auVar28 = vpaddsw_avx2(auVar79,auVar81);
  auVar80 = vpsubsw_avx2(auVar79,auVar81);
  auVar83 = vpunpcklwd_avx2(auVar67,auVar55);
  auVar79 = vpunpckhwd_avx2(auVar67,auVar55);
  auVar78 = vpmaddwd_avx2(auVar83,local_e80);
  auVar78 = vpaddd_avx2(auVar78,auVar37);
  auVar49 = vpmaddwd_avx2(auVar79,local_e80);
  auVar49 = vpaddd_avx2(auVar49,auVar37);
  auVar81 = vpsrad_avx2(auVar78,0xc);
  auVar78 = vpsrad_avx2(auVar49,0xc);
  auVar78 = vpackssdw_avx2(auVar81,auVar78);
  auVar49 = vpmaddwd_avx2(local_12a0,auVar83);
  auVar79 = vpmaddwd_avx2(auVar79,local_12a0);
  auVar49 = vpaddd_avx2(auVar49,auVar37);
  auVar79 = vpaddd_avx2(auVar79,auVar37);
  auVar49 = vpsrad_avx2(auVar49,0xc);
  auVar79 = vpsrad_avx2(auVar79,0xc);
  auVar49 = vpackssdw_avx2(auVar49,auVar79);
  auVar67 = vpunpcklwd_avx2(auVar54,auVar50);
  auVar81 = vpunpckhwd_avx2(auVar54,auVar50);
  auVar79 = vpmaddwd_avx2(local_1280,auVar67);
  auVar79 = vpaddd_avx2(auVar79,auVar37);
  auVar83 = vpmaddwd_avx2(auVar81,local_1280);
  auVar83 = vpaddd_avx2(auVar83,auVar37);
  auVar79 = vpsrad_avx2(auVar79,0xc);
  auVar83 = vpsrad_avx2(auVar83,0xc);
  auVar79 = vpackssdw_avx2(auVar79,auVar83);
  auVar83 = vpmaddwd_avx2(auVar67,local_e80);
  auVar81 = vpmaddwd_avx2(auVar81,local_e80);
  auVar83 = vpaddd_avx2(auVar83,auVar37);
  auVar81 = vpaddd_avx2(auVar81,auVar37);
  auVar83 = vpsrad_avx2(auVar83,0xc);
  auVar81 = vpsrad_avx2(auVar81,0xc);
  auVar83 = vpackssdw_avx2(auVar83,auVar81);
  auVar1 = vpaddsw_avx2(local_600,local_660);
  auVar82 = vpsubsw_avx2(local_660,local_600);
  auVar29 = vpaddsw_avx2(auVar52,auVar63);
  auVar4 = vpsubsw_avx2(auVar63,auVar52);
  auVar2 = vpaddsw_avx2(local_5e0,local_580);
  auVar5 = vpsubsw_avx2(local_580,local_5e0);
  auVar30 = vpaddsw_avx2(auVar65,auVar70);
  auVar6 = vpsubsw_avx2(auVar65,auVar70);
  auVar31 = vpaddsw_avx2(local_500,local_560);
  auVar7 = vpsubsw_avx2(local_560,local_500);
  auVar32 = vpaddsw_avx2(auVar64,auVar53);
  auVar8 = vpsubsw_avx2(auVar64,auVar53);
  auVar33 = vpaddsw_avx2(local_4e0,local_480);
  auVar9 = vpsubsw_avx2(local_480,local_4e0);
  auVar34 = vpaddsw_avx2(auVar51,auVar69);
  auVar10 = vpsubsw_avx2(auVar69,auVar51);
  auVar51 = vpunpcklwd_avx2(auVar57,auVar47);
  auVar52 = vpunpckhwd_avx2(auVar57,auVar47);
  auVar63 = vpmaddwd_avx2(auVar51,auVar56);
  auVar63 = vpaddd_avx2(auVar63,auVar37);
  auVar69 = vpmaddwd_avx2(auVar52,auVar56);
  auVar69 = vpaddd_avx2(auVar69,auVar37);
  auVar63 = vpsrad_avx2(auVar63,0xc);
  auVar69 = vpsrad_avx2(auVar69,0xc);
  auVar63 = vpackssdw_avx2(auVar63,auVar69);
  auVar69 = vpmaddwd_avx2(auVar77,auVar51);
  auVar52 = vpmaddwd_avx2(auVar77,auVar52);
  auVar69 = vpaddd_avx2(auVar69,auVar37);
  auVar52 = vpaddd_avx2(auVar52,auVar37);
  auVar69 = vpsrad_avx2(auVar69,0xc);
  auVar52 = vpsrad_avx2(auVar52,0xc);
  auVar69 = vpackssdw_avx2(auVar69,auVar52);
  auVar70 = vpunpcklwd_avx2(auVar66,auVar46);
  auVar51 = vpunpckhwd_avx2(auVar66,auVar46);
  auVar52 = vpmaddwd_avx2(auVar70,auVar56);
  auVar70 = vpmaddwd_avx2(auVar77,auVar70);
  auVar53 = vpmaddwd_avx2(auVar77,auVar51);
  auVar51 = vpmaddwd_avx2(auVar51,auVar56);
  auVar52 = vpaddd_avx2(auVar52,auVar37);
  auVar51 = vpaddd_avx2(auVar51,auVar37);
  auVar65 = vpsrad_avx2(auVar52,0xc);
  auVar52 = vpsrad_avx2(auVar51,0xc);
  auVar52 = vpackssdw_avx2(auVar65,auVar52);
  auVar51 = vpaddd_avx2(auVar70,auVar37);
  auVar70 = vpaddd_avx2(auVar53,auVar37);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar70 = vpsrad_avx2(auVar70,0xc);
  auVar51 = vpackssdw_avx2(auVar51,auVar70);
  auVar64 = vpunpcklwd_avx2(auVar58,auVar44);
  auVar65 = vpunpckhwd_avx2(auVar58,auVar44);
  auVar70 = vpmaddwd_avx2(auVar76,auVar64);
  auVar70 = vpaddd_avx2(auVar70,auVar37);
  auVar53 = vpmaddwd_avx2(auVar76,auVar65);
  auVar53 = vpaddd_avx2(auVar53,auVar37);
  auVar70 = vpsrad_avx2(auVar70,0xc);
  auVar53 = vpsrad_avx2(auVar53,0xc);
  auVar70 = vpackssdw_avx2(auVar70,auVar53);
  auVar53 = vpmaddwd_avx2(auVar64,auVar56);
  auVar65 = vpmaddwd_avx2(auVar65,auVar56);
  auVar53 = vpaddd_avx2(auVar53,auVar37);
  auVar65 = vpaddd_avx2(auVar65,auVar37);
  auVar53 = vpsrad_avx2(auVar53,0xc);
  auVar65 = vpsrad_avx2(auVar65,0xc);
  auVar53 = vpackssdw_avx2(auVar53,auVar65);
  auVar81 = vpunpcklwd_avx2(auVar68,auVar45);
  auVar67 = vpunpckhwd_avx2(auVar68,auVar45);
  auVar65 = vpmaddwd_avx2(auVar76,auVar81);
  auVar64 = vpmaddwd_avx2(auVar76,auVar67);
  auVar81 = vpmaddwd_avx2(auVar81,auVar56);
  auVar67 = vpmaddwd_avx2(auVar67,auVar56);
  auVar65 = vpaddd_avx2(auVar65,auVar37);
  auVar64 = vpaddd_avx2(auVar64,auVar37);
  auVar65 = vpsrad_avx2(auVar65,0xc);
  auVar64 = vpsrad_avx2(auVar64,0xc);
  auVar65 = vpackssdw_avx2(auVar65,auVar64);
  auVar64 = vpaddd_avx2(auVar81,auVar37);
  auVar81 = vpaddd_avx2(auVar67,auVar37);
  auVar64 = vpsrad_avx2(auVar64,0xc);
  auVar81 = vpsrad_avx2(auVar81,0xc);
  auVar64 = vpackssdw_avx2(auVar64,auVar81);
  auVar50 = vpunpcklwd_avx2(auVar35,auVar43);
  auVar54 = vpunpckhwd_avx2(auVar35,auVar43);
  auVar81 = vpmaddwd_avx2(auVar50,auVar74);
  auVar81 = vpaddd_avx2(auVar81,auVar37);
  auVar67 = vpmaddwd_avx2(auVar54,auVar74);
  auVar67 = vpaddd_avx2(auVar67,auVar37);
  auVar81 = vpsrad_avx2(auVar81,0xc);
  auVar67 = vpsrad_avx2(auVar67,0xc);
  auVar81 = vpackssdw_avx2(auVar81,auVar67);
  auVar67 = vpmaddwd_avx2(auVar50,auVar71);
  auVar54 = vpmaddwd_avx2(auVar54,auVar71);
  auVar67 = vpaddd_avx2(auVar67,auVar37);
  auVar54 = vpaddd_avx2(auVar54,auVar37);
  auVar67 = vpsrad_avx2(auVar67,0xc);
  auVar54 = vpsrad_avx2(auVar54,0xc);
  auVar67 = vpackssdw_avx2(auVar67,auVar54);
  auVar55 = vpunpcklwd_avx2(auVar59,auVar42);
  auVar50 = vpunpckhwd_avx2(auVar59,auVar42);
  auVar54 = vpmaddwd_avx2(auVar55,auVar74);
  auVar55 = vpmaddwd_avx2(auVar55,auVar71);
  auVar66 = vpmaddwd_avx2(auVar50,auVar71);
  auVar50 = vpmaddwd_avx2(auVar50,auVar74);
  auVar54 = vpaddd_avx2(auVar54,auVar37);
  auVar50 = vpaddd_avx2(auVar50,auVar37);
  auVar57 = vpsrad_avx2(auVar54,0xc);
  auVar54 = vpsrad_avx2(auVar50,0xc);
  auVar54 = vpackssdw_avx2(auVar57,auVar54);
  auVar50 = vpaddd_avx2(auVar55,auVar37);
  auVar55 = vpaddd_avx2(auVar66,auVar37);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar55 = vpsrad_avx2(auVar55,0xc);
  auVar50 = vpackssdw_avx2(auVar50,auVar55);
  auVar58 = vpunpcklwd_avx2(auVar3,auVar40);
  auVar57 = vpunpckhwd_avx2(auVar3,auVar40);
  auVar55 = vpmaddwd_avx2(auVar58,auVar48);
  auVar55 = vpaddd_avx2(auVar55,auVar37);
  auVar66 = vpmaddwd_avx2(auVar57,auVar48);
  auVar66 = vpaddd_avx2(auVar66,auVar37);
  auVar55 = vpsrad_avx2(auVar55,0xc);
  auVar66 = vpsrad_avx2(auVar66,0xc);
  auVar55 = vpackssdw_avx2(auVar55,auVar66);
  auVar66 = vpmaddwd_avx2(auVar58,auVar74);
  auVar57 = vpmaddwd_avx2(auVar57,auVar74);
  auVar66 = vpaddd_avx2(auVar66,auVar37);
  auVar57 = vpaddd_avx2(auVar57,auVar37);
  auVar66 = vpsrad_avx2(auVar66,0xc);
  auVar57 = vpsrad_avx2(auVar57,0xc);
  auVar66 = vpackssdw_avx2(auVar66,auVar57);
  auVar68 = vpunpcklwd_avx2(auVar39,auVar41);
  auVar59 = vpunpckhwd_avx2(auVar39,auVar41);
  auVar57 = vpmaddwd_avx2(auVar68,auVar48);
  auVar58 = vpmaddwd_avx2(auVar59,auVar48);
  auVar68 = vpmaddwd_avx2(auVar68,auVar74);
  auVar59 = vpmaddwd_avx2(auVar59,auVar74);
  auVar57 = vpaddd_avx2(auVar57,auVar37);
  auVar58 = vpaddd_avx2(auVar58,auVar37);
  auVar57 = vpsrad_avx2(auVar57,0xc);
  auVar58 = vpsrad_avx2(auVar58,0xc);
  auVar57 = vpackssdw_avx2(auVar57,auVar58);
  auVar58 = vpaddd_avx2(auVar68,auVar37);
  auVar68 = vpaddd_avx2(auVar59,auVar37);
  auVar59 = vpsrad_avx2(auVar58,0xc);
  auVar58 = vpsrad_avx2(auVar68,0xc);
  auVar58 = vpackssdw_avx2(auVar59,auVar58);
  auVar35 = vpaddsw_avx2(auVar60,auVar36);
  auVar41 = vpsubsw_avx2(auVar60,auVar36);
  auVar36 = vpaddsw_avx2(auVar60,auVar38);
  auVar42 = vpsubsw_avx2(auVar60,auVar38);
  auVar38 = vpunpcklwd_avx2(auVar75,auVar80);
  auVar60 = vpunpckhwd_avx2(auVar75,auVar80);
  auVar59._8_4_ = 0xb50f4b0;
  auVar59._0_8_ = 0xb50f4b00b50f4b0;
  auVar59._12_4_ = 0xb50f4b0;
  auVar59._16_4_ = 0xb50f4b0;
  auVar59._20_4_ = 0xb50f4b0;
  auVar59._24_4_ = 0xb50f4b0;
  auVar59._28_4_ = 0xb50f4b0;
  auVar68 = vpmaddwd_avx2(auVar38,auVar59);
  auVar68 = vpaddd_avx2(auVar68,auVar37);
  auVar59 = vpmaddwd_avx2(auVar60,auVar59);
  auVar59 = vpaddd_avx2(auVar59,auVar37);
  auVar68 = vpsrad_avx2(auVar68,0xc);
  auVar59 = vpsrad_avx2(auVar59,0xc);
  auVar68 = vpackssdw_avx2(auVar68,auVar59);
  auVar3._8_4_ = 0xb500b50;
  auVar3._0_8_ = 0xb500b500b500b50;
  auVar3._12_4_ = 0xb500b50;
  auVar3._16_4_ = 0xb500b50;
  auVar3._20_4_ = 0xb500b50;
  auVar3._24_4_ = 0xb500b50;
  auVar3._28_4_ = 0xb500b50;
  auVar59 = vpmaddwd_avx2(auVar38,auVar3);
  auVar60 = vpmaddwd_avx2(auVar60,auVar3);
  auVar59 = vpaddd_avx2(auVar59,auVar37);
  auVar60 = vpaddd_avx2(auVar60,auVar37);
  auVar59 = vpsrad_avx2(auVar59,0xc);
  auVar60 = vpsrad_avx2(auVar60,0xc);
  auVar59 = vpackssdw_avx2(auVar59,auVar60);
  auVar38 = vpaddsw_avx2(auVar72,auVar61);
  auVar43 = vpsubsw_avx2(auVar72,auVar61);
  auVar3 = vpaddsw_avx2(auVar78,auVar79);
  auVar44 = vpsubsw_avx2(auVar78,auVar79);
  auVar39 = vpaddsw_avx2(auVar62,auVar73);
  auVar45 = vpsubsw_avx2(auVar62,auVar73);
  auVar40 = vpaddsw_avx2(auVar49,auVar83);
  auVar46 = vpsubsw_avx2(auVar49,auVar83);
  auVar83 = vpunpcklwd_avx2(auVar4,auVar10);
  auVar79 = vpunpckhwd_avx2(auVar4,auVar10);
  auVar78 = vpmaddwd_avx2(local_e80,auVar83);
  auVar78 = vpaddd_avx2(auVar78,auVar37);
  auVar49 = vpmaddwd_avx2(local_e80,auVar79);
  auVar49 = vpaddd_avx2(auVar49,auVar37);
  auVar78 = vpsrad_avx2(auVar78,0xc);
  auVar49 = vpsrad_avx2(auVar49,0xc);
  auVar78 = vpackssdw_avx2(auVar78,auVar49);
  auVar49 = vpmaddwd_avx2(auVar83,local_12a0);
  auVar79 = vpmaddwd_avx2(auVar79,local_12a0);
  auVar49 = vpaddd_avx2(auVar49,auVar37);
  auVar79 = vpaddd_avx2(auVar79,auVar37);
  auVar49 = vpsrad_avx2(auVar49,0xc);
  auVar79 = vpsrad_avx2(auVar79,0xc);
  auVar49 = vpackssdw_avx2(auVar49,auVar79);
  auVar72 = vpunpcklwd_avx2(auVar82,auVar9);
  auVar60 = vpunpckhwd_avx2(auVar82,auVar9);
  auVar79 = vpmaddwd_avx2(local_e80,auVar72);
  auVar79 = vpaddd_avx2(auVar79,auVar37);
  auVar83 = vpmaddwd_avx2(local_e80,auVar60);
  auVar83 = vpaddd_avx2(auVar83,auVar37);
  auVar79 = vpsrad_avx2(auVar79,0xc);
  auVar83 = vpsrad_avx2(auVar83,0xc);
  auVar79 = vpackssdw_avx2(auVar79,auVar83);
  auVar83 = vpmaddwd_avx2(auVar72,local_12a0);
  auVar60 = vpmaddwd_avx2(auVar60,local_12a0);
  auVar83 = vpaddd_avx2(auVar83,auVar37);
  auVar60 = vpaddd_avx2(auVar60,auVar37);
  auVar83 = vpsrad_avx2(auVar83,0xc);
  auVar60 = vpsrad_avx2(auVar60,0xc);
  auVar83 = vpackssdw_avx2(auVar83,auVar60);
  auVar73 = vpunpcklwd_avx2(auVar5,auVar7);
  auVar61 = vpunpckhwd_avx2(auVar5,auVar7);
  auVar60 = vpmaddwd_avx2(auVar73,local_1280);
  auVar60 = vpaddd_avx2(auVar60,auVar37);
  auVar72 = vpmaddwd_avx2(auVar61,local_1280);
  auVar72 = vpaddd_avx2(auVar72,auVar37);
  auVar60 = vpsrad_avx2(auVar60,0xc);
  auVar72 = vpsrad_avx2(auVar72,0xc);
  auVar60 = vpackssdw_avx2(auVar60,auVar72);
  auVar72 = vpmaddwd_avx2(local_e80,auVar73);
  auVar61 = vpmaddwd_avx2(local_e80,auVar61);
  auVar72 = vpaddd_avx2(auVar72,auVar37);
  auVar61 = vpaddd_avx2(auVar61,auVar37);
  auVar72 = vpsrad_avx2(auVar72,0xc);
  auVar61 = vpsrad_avx2(auVar61,0xc);
  auVar72 = vpackssdw_avx2(auVar72,auVar61);
  auVar47 = vpunpcklwd_avx2(auVar6,auVar8);
  auVar62 = vpunpckhwd_avx2(auVar6,auVar8);
  auVar61 = vpmaddwd_avx2(auVar47,local_1280);
  auVar61 = vpaddd_avx2(auVar61,auVar37);
  auVar73 = vpmaddwd_avx2(auVar62,local_1280);
  auVar73 = vpaddd_avx2(auVar73,auVar37);
  auVar61 = vpsrad_avx2(auVar61,0xc);
  auVar73 = vpsrad_avx2(auVar73,0xc);
  auVar61 = vpackssdw_avx2(auVar61,auVar73);
  auVar73 = vpmaddwd_avx2(local_e80,auVar47);
  auVar62 = vpmaddwd_avx2(local_e80,auVar62);
  auVar73 = vpaddd_avx2(auVar73,auVar37);
  auVar62 = vpaddd_avx2(auVar62,auVar37);
  auVar73 = vpsrad_avx2(auVar73,0xc);
  auVar62 = vpsrad_avx2(auVar62,0xc);
  auVar73 = vpackssdw_avx2(auVar73,auVar62);
  auVar62 = vpaddsw_avx2(auVar11,auVar13);
  auVar47 = vpsubsw_avx2(auVar11,auVar13);
  auVar11 = vpaddsw_avx2(auVar12,auVar14);
  auVar75 = vpsubsw_avx2(auVar12,auVar14);
  auVar12 = vpaddsw_avx2(auVar63,auVar65);
  auVar80 = vpsubsw_avx2(auVar63,auVar65);
  auVar13 = vpaddsw_avx2(auVar52,auVar70);
  auVar65 = vpsubsw_avx2(auVar52,auVar70);
  auVar14 = vpaddsw_avx2(auVar17,auVar15);
  auVar82 = vpsubsw_avx2(auVar17,auVar15);
  auVar15 = vpaddsw_avx2(auVar18,auVar16);
  auVar4 = vpsubsw_avx2(auVar18,auVar16);
  auVar16 = vpaddsw_avx2(auVar57,auVar81);
  auVar57 = vpsubsw_avx2(auVar57,auVar81);
  auVar17 = vpaddsw_avx2(auVar55,auVar54);
  auVar5 = vpsubsw_avx2(auVar55,auVar54);
  auVar18 = vpaddsw_avx2(auVar19,auVar21);
  auVar54 = vpsubsw_avx2(auVar19,auVar21);
  auVar19 = vpaddsw_avx2(auVar20,auVar22);
  auVar55 = vpsubsw_avx2(auVar20,auVar22);
  auVar20 = vpaddsw_avx2(auVar58,auVar67);
  auVar58 = vpsubsw_avx2(auVar58,auVar67);
  auVar21 = vpaddsw_avx2(auVar66,auVar50);
  auVar6 = vpsubsw_avx2(auVar66,auVar50);
  auVar22 = vpaddsw_avx2(auVar25,auVar23);
  auVar81 = vpsubsw_avx2(auVar25,auVar23);
  auVar23 = vpaddsw_avx2(auVar26,auVar24);
  auVar67 = vpsubsw_avx2(auVar26,auVar24);
  auVar24 = vpaddsw_avx2(auVar69,auVar64);
  auVar64 = vpsubsw_avx2(auVar69,auVar64);
  auVar25 = vpaddsw_avx2(auVar51,auVar53);
  auVar53 = vpsubsw_avx2(auVar51,auVar53);
  auVar26 = vpaddsw_avx2(auVar35,auVar28);
  auVar7 = vpsubsw_avx2(auVar35,auVar28);
  auVar28 = vpaddsw_avx2(auVar59,auVar36);
  auVar8 = vpsubsw_avx2(auVar36,auVar59);
  auVar59 = vpaddsw_avx2(auVar68,auVar42);
  auVar42 = vpsubsw_avx2(auVar42,auVar68);
  auVar35 = vpaddsw_avx2(auVar27,auVar41);
  auVar36 = vpsubsw_avx2(auVar41,auVar27);
  auVar51 = vpunpcklwd_avx2(auVar44,auVar46);
  auVar52 = vpunpckhwd_avx2(auVar44,auVar46);
  auVar66._8_4_ = 0xb50f4b0;
  auVar66._0_8_ = 0xb50f4b00b50f4b0;
  auVar66._12_4_ = 0xb50f4b0;
  auVar66._16_4_ = 0xb50f4b0;
  auVar66._20_4_ = 0xb50f4b0;
  auVar66._24_4_ = 0xb50f4b0;
  auVar66._28_4_ = 0xb50f4b0;
  auVar63 = vpmaddwd_avx2(auVar51,auVar66);
  auVar63 = vpaddd_avx2(auVar63,auVar37);
  auVar69 = vpmaddwd_avx2(auVar52,auVar66);
  auVar69 = vpaddd_avx2(auVar69,auVar37);
  auVar63 = vpsrad_avx2(auVar63,0xc);
  auVar69 = vpsrad_avx2(auVar69,0xc);
  auVar63 = vpackssdw_avx2(auVar63,auVar69);
  auVar68._8_4_ = 0xb500b50;
  auVar68._0_8_ = 0xb500b500b500b50;
  auVar68._12_4_ = 0xb500b50;
  auVar68._16_4_ = 0xb500b50;
  auVar68._20_4_ = 0xb500b50;
  auVar68._24_4_ = 0xb500b50;
  auVar68._28_4_ = 0xb500b50;
  auVar69 = vpmaddwd_avx2(auVar51,auVar68);
  auVar52 = vpmaddwd_avx2(auVar52,auVar68);
  auVar69 = vpaddd_avx2(auVar69,auVar37);
  auVar52 = vpaddd_avx2(auVar52,auVar37);
  auVar51 = vpsrad_avx2(auVar69,0xc);
  auVar69 = vpsrad_avx2(auVar52,0xc);
  auVar69 = vpackssdw_avx2(auVar51,auVar69);
  auVar50 = vpunpcklwd_avx2(auVar43,auVar45);
  auVar70 = vpunpckhwd_avx2(auVar43,auVar45);
  auVar52 = vpmaddwd_avx2(auVar50,auVar66);
  auVar52 = vpaddd_avx2(auVar52,auVar37);
  auVar51 = vpmaddwd_avx2(auVar70,auVar66);
  auVar51 = vpaddd_avx2(auVar51,auVar37);
  auVar52 = vpsrad_avx2(auVar52,0xc);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar52 = vpackssdw_avx2(auVar52,auVar51);
  auVar51 = vpmaddwd_avx2(auVar50,auVar68);
  auVar70 = vpmaddwd_avx2(auVar70,auVar68);
  auVar51 = vpaddd_avx2(auVar51,auVar37);
  auVar70 = vpaddd_avx2(auVar70,auVar37);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar70 = vpsrad_avx2(auVar70,0xc);
  auVar51 = vpackssdw_avx2(auVar51,auVar70);
  auVar27 = vpaddsw_avx2(auVar1,auVar2);
  auVar41 = vpsubsw_avx2(auVar1,auVar2);
  auVar1 = vpaddsw_avx2(auVar29,auVar30);
  auVar43 = vpsubsw_avx2(auVar29,auVar30);
  auVar29 = vpaddsw_avx2(auVar78,auVar61);
  auVar61 = vpsubsw_avx2(auVar78,auVar61);
  auVar2 = vpaddsw_avx2(auVar79,auVar60);
  auVar44 = vpsubsw_avx2(auVar79,auVar60);
  auVar30 = vpaddsw_avx2(auVar33,auVar31);
  auVar45 = vpsubsw_avx2(auVar33,auVar31);
  auVar31 = vpaddsw_avx2(auVar34,auVar32);
  auVar46 = vpsubsw_avx2(auVar34,auVar32);
  auVar32 = vpaddsw_avx2(auVar49,auVar73);
  auVar9 = vpsubsw_avx2(auVar49,auVar73);
  auVar73 = vpaddsw_avx2(auVar83,auVar72);
  auVar72 = vpsubsw_avx2(auVar83,auVar72);
  auVar78 = vpunpcklwd_avx2(auVar65,auVar53);
  auVar65 = vpunpckhwd_avx2(auVar65,auVar53);
  auVar70 = vpmaddwd_avx2(local_e80,auVar78);
  auVar70 = vpaddd_avx2(auVar70,auVar37);
  auVar53 = vpmaddwd_avx2(local_e80,auVar65);
  auVar53 = vpaddd_avx2(auVar53,auVar37);
  auVar70 = vpsrad_avx2(auVar70,0xc);
  auVar53 = vpsrad_avx2(auVar53,0xc);
  auVar70 = vpackssdw_avx2(auVar70,auVar53);
  auVar53 = vpmaddwd_avx2(auVar78,local_12a0);
  auVar65 = vpmaddwd_avx2(auVar65,local_12a0);
  auVar53 = vpaddd_avx2(auVar53,auVar37);
  auVar65 = vpaddd_avx2(auVar65,auVar37);
  auVar78 = vpsrad_avx2(auVar53,0xc);
  auVar53 = vpsrad_avx2(auVar65,0xc);
  auVar53 = vpackssdw_avx2(auVar78,auVar53);
  auVar49 = vpunpcklwd_avx2(auVar80,auVar64);
  auVar78 = vpunpckhwd_avx2(auVar80,auVar64);
  auVar65 = vpmaddwd_avx2(local_e80,auVar49);
  auVar65 = vpaddd_avx2(auVar65,auVar37);
  auVar64 = vpmaddwd_avx2(local_e80,auVar78);
  auVar64 = vpaddd_avx2(auVar64,auVar37);
  auVar65 = vpsrad_avx2(auVar65,0xc);
  auVar64 = vpsrad_avx2(auVar64,0xc);
  auVar65 = vpackssdw_avx2(auVar65,auVar64);
  auVar64 = vpmaddwd_avx2(auVar49,local_12a0);
  auVar78 = vpmaddwd_avx2(auVar78,local_12a0);
  auVar64 = vpaddd_avx2(auVar64,auVar37);
  auVar78 = vpaddd_avx2(auVar78,auVar37);
  auVar64 = vpsrad_avx2(auVar64,0xc);
  auVar78 = vpsrad_avx2(auVar78,0xc);
  auVar64 = vpackssdw_avx2(auVar64,auVar78);
  auVar83 = vpunpcklwd_avx2(auVar75,auVar67);
  auVar79 = vpunpckhwd_avx2(auVar75,auVar67);
  auVar78 = vpmaddwd_avx2(local_e80,auVar83);
  auVar78 = vpaddd_avx2(auVar78,auVar37);
  auVar49 = vpmaddwd_avx2(local_e80,auVar79);
  auVar49 = vpaddd_avx2(auVar49,auVar37);
  auVar78 = vpsrad_avx2(auVar78,0xc);
  auVar49 = vpsrad_avx2(auVar49,0xc);
  auVar78 = vpackssdw_avx2(auVar78,auVar49);
  auVar49 = vpmaddwd_avx2(auVar83,local_12a0);
  auVar79 = vpmaddwd_avx2(auVar79,local_12a0);
  auVar49 = vpaddd_avx2(auVar49,auVar37);
  auVar79 = vpaddd_avx2(auVar79,auVar37);
  auVar49 = vpsrad_avx2(auVar49,0xc);
  auVar79 = vpsrad_avx2(auVar79,0xc);
  auVar49 = vpackssdw_avx2(auVar49,auVar79);
  auVar67 = vpunpcklwd_avx2(auVar47,auVar81);
  auVar83 = vpunpckhwd_avx2(auVar47,auVar81);
  auVar79 = vpmaddwd_avx2(local_e80,auVar67);
  auVar81 = vpmaddwd_avx2(auVar67,local_12a0);
  auVar67 = vpmaddwd_avx2(auVar83,local_12a0);
  auVar83 = vpmaddwd_avx2(local_e80,auVar83);
  auVar79 = vpaddd_avx2(auVar79,auVar37);
  auVar83 = vpaddd_avx2(auVar83,auVar37);
  auVar50 = vpsrad_avx2(auVar79,0xc);
  auVar79 = vpsrad_avx2(auVar83,0xc);
  auVar79 = vpackssdw_avx2(auVar50,auVar79);
  auVar83 = vpaddd_avx2(auVar81,auVar37);
  auVar81 = vpaddd_avx2(auVar67,auVar37);
  auVar83 = vpsrad_avx2(auVar83,0xc);
  auVar81 = vpsrad_avx2(auVar81,0xc);
  auVar83 = vpackssdw_avx2(auVar83,auVar81);
  auVar50 = vpunpcklwd_avx2(auVar82,auVar54);
  auVar54 = vpunpckhwd_avx2(auVar82,auVar54);
  auVar81 = vpmaddwd_avx2(auVar50,local_1280);
  auVar81 = vpaddd_avx2(auVar81,auVar37);
  auVar67 = vpmaddwd_avx2(auVar54,local_1280);
  auVar67 = vpaddd_avx2(auVar67,auVar37);
  auVar81 = vpsrad_avx2(auVar81,0xc);
  auVar67 = vpsrad_avx2(auVar67,0xc);
  auVar81 = vpackssdw_avx2(auVar81,auVar67);
  auVar67 = vpmaddwd_avx2(local_e80,auVar50);
  auVar54 = vpmaddwd_avx2(local_e80,auVar54);
  auVar67 = vpaddd_avx2(auVar67,auVar37);
  auVar54 = vpaddd_avx2(auVar54,auVar37);
  auVar67 = vpsrad_avx2(auVar67,0xc);
  auVar54 = vpsrad_avx2(auVar54,0xc);
  auVar67 = vpackssdw_avx2(auVar67,auVar54);
  auVar66 = vpunpcklwd_avx2(auVar4,auVar55);
  auVar55 = vpunpckhwd_avx2(auVar4,auVar55);
  auVar54 = vpmaddwd_avx2(auVar66,local_1280);
  auVar54 = vpaddd_avx2(auVar54,auVar37);
  auVar50 = vpmaddwd_avx2(auVar55,local_1280);
  auVar50 = vpaddd_avx2(auVar50,auVar37);
  auVar54 = vpsrad_avx2(auVar54,0xc);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar54 = vpackssdw_avx2(auVar54,auVar50);
  auVar50 = vpmaddwd_avx2(local_e80,auVar66);
  auVar55 = vpmaddwd_avx2(local_e80,auVar55);
  auVar50 = vpaddd_avx2(auVar50,auVar37);
  auVar55 = vpaddd_avx2(auVar55,auVar37);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar55 = vpsrad_avx2(auVar55,0xc);
  auVar50 = vpackssdw_avx2(auVar50,auVar55);
  auVar68 = vpunpcklwd_avx2(auVar57,auVar58);
  auVar57 = vpunpckhwd_avx2(auVar57,auVar58);
  auVar55 = vpmaddwd_avx2(auVar68,local_1280);
  auVar55 = vpaddd_avx2(auVar55,auVar37);
  auVar66 = vpmaddwd_avx2(auVar57,local_1280);
  auVar66 = vpaddd_avx2(auVar66,auVar37);
  auVar55 = vpsrad_avx2(auVar55,0xc);
  auVar66 = vpsrad_avx2(auVar66,0xc);
  auVar55 = vpackssdw_avx2(auVar55,auVar66);
  auVar66 = vpmaddwd_avx2(local_e80,auVar68);
  auVar57 = vpmaddwd_avx2(local_e80,auVar57);
  auVar66 = vpaddd_avx2(auVar66,auVar37);
  auVar57 = vpaddd_avx2(auVar57,auVar37);
  auVar66 = vpsrad_avx2(auVar66,0xc);
  auVar57 = vpsrad_avx2(auVar57,0xc);
  auVar66 = vpackssdw_avx2(auVar66,auVar57);
  auVar68 = vpunpcklwd_avx2(auVar5,auVar6);
  auVar60 = vpunpckhwd_avx2(auVar5,auVar6);
  auVar57 = vpmaddwd_avx2(auVar68,local_1280);
  auVar58 = vpmaddwd_avx2(auVar60,local_1280);
  auVar68 = vpmaddwd_avx2(local_e80,auVar68);
  auVar60 = vpmaddwd_avx2(local_e80,auVar60);
  auVar57 = vpaddd_avx2(auVar57,auVar37);
  auVar58 = vpaddd_avx2(auVar58,auVar37);
  auVar57 = vpsrad_avx2(auVar57,0xc);
  auVar58 = vpsrad_avx2(auVar58,0xc);
  auVar57 = vpackssdw_avx2(auVar57,auVar58);
  auVar58 = vpaddd_avx2(auVar68,auVar37);
  auVar68 = vpaddd_avx2(auVar60,auVar37);
  auVar60 = vpsrad_avx2(auVar58,0xc);
  auVar58 = vpsrad_avx2(auVar68,0xc);
  auVar58 = vpackssdw_avx2(auVar60,auVar58);
  auVar33 = vpaddsw_avx2(auVar26,auVar39);
  auVar47 = vpsubsw_avx2(auVar26,auVar39);
  auVar26 = vpaddsw_avx2(auVar28,auVar40);
  auVar40 = vpsubsw_avx2(auVar28,auVar40);
  auVar28 = vpaddsw_avx2(auVar59,auVar69);
  auVar75 = vpsubsw_avx2(auVar59,auVar69);
  auVar34 = vpaddsw_avx2(auVar51,auVar35);
  auVar80 = vpsubsw_avx2(auVar35,auVar51);
  auVar35 = vpaddsw_avx2(auVar52,auVar36);
  auVar82 = vpsubsw_avx2(auVar36,auVar52);
  auVar36 = vpaddsw_avx2(auVar42,auVar63);
  auVar42 = vpsubsw_avx2(auVar42,auVar63);
  auVar39 = vpaddsw_avx2(auVar8,auVar3);
  auVar4 = vpsubsw_avx2(auVar8,auVar3);
  auVar3 = vpaddsw_avx2(auVar7,auVar38);
  auVar38 = vpsubsw_avx2(auVar7,auVar38);
  auVar51 = vpunpcklwd_avx2(auVar44,auVar72);
  auVar52 = vpunpckhwd_avx2(auVar44,auVar72);
  auVar8._8_4_ = 0xb50f4b0;
  auVar8._0_8_ = 0xb50f4b00b50f4b0;
  auVar8._12_4_ = 0xb50f4b0;
  auVar8._16_4_ = 0xb50f4b0;
  auVar8._20_4_ = 0xb50f4b0;
  auVar8._24_4_ = 0xb50f4b0;
  auVar8._28_4_ = 0xb50f4b0;
  auVar63 = vpmaddwd_avx2(auVar51,auVar8);
  auVar63 = vpaddd_avx2(auVar63,auVar37);
  auVar69 = vpmaddwd_avx2(auVar52,auVar8);
  auVar69 = vpaddd_avx2(auVar69,auVar37);
  auVar63 = vpsrad_avx2(auVar63,0xc);
  auVar69 = vpsrad_avx2(auVar69,0xc);
  auVar63 = vpackssdw_avx2(auVar63,auVar69);
  auVar10._8_4_ = 0xb500b50;
  auVar10._0_8_ = 0xb500b500b500b50;
  auVar10._12_4_ = 0xb500b50;
  auVar10._16_4_ = 0xb500b50;
  auVar10._20_4_ = 0xb500b50;
  auVar10._24_4_ = 0xb500b50;
  auVar10._28_4_ = 0xb500b50;
  auVar69 = vpmaddwd_avx2(auVar10,auVar51);
  auVar52 = vpmaddwd_avx2(auVar10,auVar52);
  auVar69 = vpaddd_avx2(auVar69,auVar37);
  auVar52 = vpaddd_avx2(auVar52,auVar37);
  auVar69 = vpsrad_avx2(auVar69,0xc);
  auVar52 = vpsrad_avx2(auVar52,0xc);
  auVar69 = vpackssdw_avx2(auVar69,auVar52);
  auVar59 = vpunpcklwd_avx2(auVar61,auVar9);
  auVar68 = vpunpckhwd_avx2(auVar61,auVar9);
  auVar52 = vpmaddwd_avx2(auVar59,auVar8);
  auVar52 = vpaddd_avx2(auVar52,auVar37);
  auVar51 = vpmaddwd_avx2(auVar68,auVar8);
  auVar51 = vpaddd_avx2(auVar51,auVar37);
  auVar52 = vpsrad_avx2(auVar52,0xc);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar52 = vpackssdw_avx2(auVar52,auVar51);
  auVar51 = vpmaddwd_avx2(auVar10,auVar59);
  auVar68 = vpmaddwd_avx2(auVar10,auVar68);
  auVar51 = vpaddd_avx2(auVar51,auVar37);
  auVar68 = vpaddd_avx2(auVar68,auVar37);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar68 = vpsrad_avx2(auVar68,0xc);
  auVar51 = vpackssdw_avx2(auVar51,auVar68);
  auVar72 = vpunpcklwd_avx2(auVar43,auVar46);
  auVar60 = vpunpckhwd_avx2(auVar43,auVar46);
  auVar68 = vpmaddwd_avx2(auVar72,auVar8);
  auVar68 = vpaddd_avx2(auVar68,auVar37);
  auVar59 = vpmaddwd_avx2(auVar60,auVar8);
  auVar59 = vpaddd_avx2(auVar59,auVar37);
  auVar68 = vpsrad_avx2(auVar68,0xc);
  auVar59 = vpsrad_avx2(auVar59,0xc);
  auVar68 = vpackssdw_avx2(auVar68,auVar59);
  auVar59 = vpmaddwd_avx2(auVar10,auVar72);
  auVar60 = vpmaddwd_avx2(auVar10,auVar60);
  auVar59 = vpaddd_avx2(auVar59,auVar37);
  auVar60 = vpaddd_avx2(auVar60,auVar37);
  auVar59 = vpsrad_avx2(auVar59,0xc);
  auVar60 = vpsrad_avx2(auVar60,0xc);
  auVar59 = vpackssdw_avx2(auVar59,auVar60);
  auVar43 = vpunpcklwd_avx2(auVar41,auVar45);
  auVar61 = vpunpckhwd_avx2(auVar41,auVar45);
  auVar60 = vpmaddwd_avx2(auVar43,auVar8);
  auVar60 = vpaddd_avx2(auVar60,auVar37);
  auVar72 = vpmaddwd_avx2(auVar61,auVar8);
  auVar72 = vpaddd_avx2(auVar72,auVar37);
  auVar60 = vpsrad_avx2(auVar60,0xc);
  auVar72 = vpsrad_avx2(auVar72,0xc);
  auVar60 = vpackssdw_avx2(auVar60,auVar72);
  auVar72 = vpmaddwd_avx2(auVar10,auVar43);
  auVar61 = vpmaddwd_avx2(auVar10,auVar61);
  auVar72 = vpaddd_avx2(auVar72,auVar37);
  auVar61 = vpaddd_avx2(auVar61,auVar37);
  auVar72 = vpsrad_avx2(auVar72,0xc);
  auVar61 = vpsrad_avx2(auVar61,0xc);
  auVar72 = vpackssdw_avx2(auVar72,auVar61);
  auVar61 = vpaddsw_avx2(auVar14,auVar62);
  auVar41 = vpsubsw_avx2(auVar62,auVar14);
  auVar62 = vpaddsw_avx2(auVar15,auVar11);
  auVar43 = vpsubsw_avx2(auVar11,auVar15);
  auVar11 = vpaddsw_avx2(auVar16,auVar12);
  auVar44 = vpsubsw_avx2(auVar12,auVar16);
  auVar12 = vpaddsw_avx2(auVar17,auVar13);
  auVar45 = vpsubsw_avx2(auVar13,auVar17);
  auVar13 = vpaddsw_avx2(auVar70,auVar57);
  auVar46 = vpsubsw_avx2(auVar70,auVar57);
  auVar57 = vpaddsw_avx2(auVar65,auVar55);
  auVar65 = vpsubsw_avx2(auVar65,auVar55);
  auVar14 = vpaddsw_avx2(auVar78,auVar54);
  auVar70 = vpsubsw_avx2(auVar78,auVar54);
  auVar15 = vpaddsw_avx2(auVar79,auVar81);
  auVar78 = vpsubsw_avx2(auVar79,auVar81);
  auVar16 = vpaddsw_avx2(auVar22,auVar18);
  auVar55 = vpsubsw_avx2(auVar22,auVar18);
  auVar17 = vpaddsw_avx2(auVar23,auVar19);
  auVar54 = vpsubsw_avx2(auVar23,auVar19);
  auVar18 = vpaddsw_avx2(auVar24,auVar20);
  auVar81 = vpsubsw_avx2(auVar24,auVar20);
  auVar19 = vpaddsw_avx2(auVar25,auVar21);
  auVar79 = vpsubsw_avx2(auVar25,auVar21);
  auVar20 = vpaddsw_avx2(auVar58,auVar53);
  auVar5 = vpsubsw_avx2(auVar53,auVar58);
  auVar58 = vpaddsw_avx2(auVar64,auVar66);
  auVar53 = vpsubsw_avx2(auVar64,auVar66);
  auVar21 = vpaddsw_avx2(auVar49,auVar50);
  auVar64 = vpsubsw_avx2(auVar49,auVar50);
  auVar22 = vpaddsw_avx2(auVar83,auVar67);
  auVar49 = vpsubsw_avx2(auVar83,auVar67);
  auVar23 = vpaddsw_avx2(auVar30,auVar33);
  auVar33 = vpsubsw_avx2(auVar33,auVar30);
  auVar24 = vpaddsw_avx2(auVar31,auVar26);
  auVar6 = vpsubsw_avx2(auVar26,auVar31);
  auVar25 = vpaddsw_avx2(auVar32,auVar28);
  auVar7 = vpsubsw_avx2(auVar28,auVar32);
  auVar26 = vpaddsw_avx2(auVar73,auVar34);
  auVar34 = vpsubsw_avx2(auVar34,auVar73);
  auVar73 = vpaddsw_avx2(auVar69,auVar35);
  auVar35 = vpsubsw_avx2(auVar35,auVar69);
  auVar28 = vpaddsw_avx2(auVar51,auVar36);
  auVar36 = vpsubsw_avx2(auVar36,auVar51);
  auVar30 = vpaddsw_avx2(auVar59,auVar39);
  auVar39 = vpsubsw_avx2(auVar39,auVar59);
  auVar59 = vpaddsw_avx2(auVar3,auVar72);
  auVar3 = vpsubsw_avx2(auVar3,auVar72);
  auVar72 = vpaddsw_avx2(auVar60,auVar38);
  auVar38 = vpsubsw_avx2(auVar38,auVar60);
  auVar60 = vpaddsw_avx2(auVar4,auVar68);
  auVar4 = vpsubsw_avx2(auVar4,auVar68);
  auVar68 = vpaddsw_avx2(auVar42,auVar52);
  auVar42 = vpsubsw_avx2(auVar42,auVar52);
  auVar31 = vpaddsw_avx2(auVar82,auVar63);
  auVar82 = vpsubsw_avx2(auVar82,auVar63);
  auVar32 = vpaddsw_avx2(auVar80,auVar2);
  auVar80 = vpsubsw_avx2(auVar80,auVar2);
  auVar2 = vpaddsw_avx2(auVar29,auVar75);
  auVar75 = vpsubsw_avx2(auVar75,auVar29);
  auVar29 = vpaddsw_avx2(auVar1,auVar40);
  auVar40 = vpsubsw_avx2(auVar40,auVar1);
  auVar1 = vpaddsw_avx2(auVar27,auVar47);
  auVar27 = vpsubsw_avx2(auVar47,auVar27);
  auVar51 = vpunpcklwd_avx2(auVar78,auVar49);
  auVar52 = vpunpckhwd_avx2(auVar78,auVar49);
  auVar63 = vpmaddwd_avx2(auVar51,auVar8);
  auVar63 = vpaddd_avx2(auVar63,auVar37);
  auVar69 = vpmaddwd_avx2(auVar52,auVar8);
  auVar69 = vpaddd_avx2(auVar69,auVar37);
  auVar63 = vpsrad_avx2(auVar63,0xc);
  auVar69 = vpsrad_avx2(auVar69,0xc);
  auVar63 = vpackssdw_avx2(auVar63,auVar69);
  auVar69 = vpmaddwd_avx2(auVar10,auVar51);
  auVar52 = vpmaddwd_avx2(auVar10,auVar52);
  auVar69 = vpaddd_avx2(auVar69,auVar37);
  auVar52 = vpaddd_avx2(auVar52,auVar37);
  auVar51 = vpsrad_avx2(auVar69,0xc);
  auVar69 = vpsrad_avx2(auVar52,0xc);
  auVar69 = vpackssdw_avx2(auVar51,auVar69);
  auVar78 = vpunpcklwd_avx2(auVar70,auVar64);
  auVar70 = vpunpckhwd_avx2(auVar70,auVar64);
  auVar52 = vpmaddwd_avx2(auVar78,auVar8);
  auVar52 = vpaddd_avx2(auVar52,auVar37);
  auVar51 = vpmaddwd_avx2(auVar70,auVar8);
  auVar51 = vpaddd_avx2(auVar51,auVar37);
  auVar52 = vpsrad_avx2(auVar52,0xc);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar52 = vpackssdw_avx2(auVar52,auVar51);
  auVar51 = vpmaddwd_avx2(auVar10,auVar78);
  auVar70 = vpmaddwd_avx2(auVar10,auVar70);
  auVar51 = vpaddd_avx2(auVar51,auVar37);
  auVar70 = vpaddd_avx2(auVar70,auVar37);
  auVar51 = vpsrad_avx2(auVar51,0xc);
  auVar70 = vpsrad_avx2(auVar70,0xc);
  auVar51 = vpackssdw_avx2(auVar51,auVar70);
  auVar64 = vpunpcklwd_avx2(auVar65,auVar53);
  auVar65 = vpunpckhwd_avx2(auVar65,auVar53);
  auVar70 = vpmaddwd_avx2(auVar64,auVar8);
  auVar70 = vpaddd_avx2(auVar70,auVar37);
  auVar53 = vpmaddwd_avx2(auVar65,auVar8);
  auVar53 = vpaddd_avx2(auVar53,auVar37);
  auVar70 = vpsrad_avx2(auVar70,0xc);
  auVar53 = vpsrad_avx2(auVar53,0xc);
  auVar70 = vpackssdw_avx2(auVar70,auVar53);
  auVar53 = vpmaddwd_avx2(auVar10,auVar64);
  auVar65 = vpmaddwd_avx2(auVar10,auVar65);
  auVar53 = vpaddd_avx2(auVar53,auVar37);
  auVar65 = vpaddd_avx2(auVar65,auVar37);
  auVar53 = vpsrad_avx2(auVar53,0xc);
  auVar65 = vpsrad_avx2(auVar65,0xc);
  auVar53 = vpackssdw_avx2(auVar53,auVar65);
  auVar49 = vpunpcklwd_avx2(auVar46,auVar5);
  auVar78 = vpunpckhwd_avx2(auVar46,auVar5);
  auVar65 = vpmaddwd_avx2(auVar49,auVar8);
  auVar65 = vpaddd_avx2(auVar65,auVar37);
  auVar64 = vpmaddwd_avx2(auVar78,auVar8);
  auVar64 = vpaddd_avx2(auVar64,auVar37);
  auVar65 = vpsrad_avx2(auVar65,0xc);
  auVar64 = vpsrad_avx2(auVar64,0xc);
  auVar65 = vpackssdw_avx2(auVar65,auVar64);
  auVar64 = vpmaddwd_avx2(auVar10,auVar49);
  auVar78 = vpmaddwd_avx2(auVar10,auVar78);
  auVar64 = vpaddd_avx2(auVar64,auVar37);
  auVar78 = vpaddd_avx2(auVar78,auVar37);
  auVar64 = vpsrad_avx2(auVar64,0xc);
  auVar78 = vpsrad_avx2(auVar78,0xc);
  auVar64 = vpackssdw_avx2(auVar64,auVar78);
  auVar83 = vpunpcklwd_avx2(auVar45,auVar79);
  auVar79 = vpunpckhwd_avx2(auVar45,auVar79);
  auVar78 = vpmaddwd_avx2(auVar8,auVar83);
  auVar78 = vpaddd_avx2(auVar78,auVar37);
  auVar49 = vpmaddwd_avx2(auVar8,auVar79);
  auVar49 = vpaddd_avx2(auVar49,auVar37);
  auVar78 = vpsrad_avx2(auVar78,0xc);
  auVar49 = vpsrad_avx2(auVar49,0xc);
  auVar78 = vpackssdw_avx2(auVar78,auVar49);
  auVar49 = vpmaddwd_avx2(auVar10,auVar83);
  auVar79 = vpmaddwd_avx2(auVar10,auVar79);
  auVar49 = vpaddd_avx2(auVar49,auVar37);
  auVar79 = vpaddd_avx2(auVar79,auVar37);
  auVar49 = vpsrad_avx2(auVar49,0xc);
  auVar79 = vpsrad_avx2(auVar79,0xc);
  auVar49 = vpackssdw_avx2(auVar49,auVar79);
  auVar67 = vpunpcklwd_avx2(auVar44,auVar81);
  auVar81 = vpunpckhwd_avx2(auVar44,auVar81);
  auVar79 = vpmaddwd_avx2(auVar8,auVar67);
  auVar79 = vpaddd_avx2(auVar79,auVar37);
  auVar83 = vpmaddwd_avx2(auVar81,auVar8);
  auVar83 = vpaddd_avx2(auVar83,auVar37);
  auVar79 = vpsrad_avx2(auVar79,0xc);
  auVar83 = vpsrad_avx2(auVar83,0xc);
  auVar79 = vpackssdw_avx2(auVar79,auVar83);
  auVar83 = vpmaddwd_avx2(auVar67,auVar10);
  auVar81 = vpmaddwd_avx2(auVar81,auVar10);
  auVar83 = vpaddd_avx2(auVar83,auVar37);
  auVar81 = vpaddd_avx2(auVar81,auVar37);
  auVar83 = vpsrad_avx2(auVar83,0xc);
  auVar81 = vpsrad_avx2(auVar81,0xc);
  auVar83 = vpackssdw_avx2(auVar83,auVar81);
  auVar50 = vpunpcklwd_avx2(auVar43,auVar54);
  auVar54 = vpunpckhwd_avx2(auVar43,auVar54);
  auVar81 = vpmaddwd_avx2(auVar50,auVar8);
  auVar81 = vpaddd_avx2(auVar81,auVar37);
  auVar67 = vpmaddwd_avx2(auVar54,auVar8);
  auVar67 = vpaddd_avx2(auVar67,auVar37);
  auVar81 = vpsrad_avx2(auVar81,0xc);
  auVar67 = vpsrad_avx2(auVar67,0xc);
  auVar81 = vpackssdw_avx2(auVar81,auVar67);
  auVar67 = vpmaddwd_avx2(auVar50,auVar10);
  auVar54 = vpmaddwd_avx2(auVar54,auVar10);
  auVar67 = vpaddd_avx2(auVar67,auVar37);
  auVar54 = vpaddd_avx2(auVar54,auVar37);
  auVar67 = vpsrad_avx2(auVar67,0xc);
  auVar54 = vpsrad_avx2(auVar54,0xc);
  auVar67 = vpackssdw_avx2(auVar67,auVar54);
  auVar43 = vpunpcklwd_avx2(auVar41,auVar55);
  auVar66 = vpunpckhwd_avx2(auVar41,auVar55);
  auVar54 = vpmaddwd_avx2(auVar43,auVar8);
  auVar50 = vpmaddwd_avx2(auVar66,auVar8);
  auVar55 = vpmaddwd_avx2(auVar43,auVar10);
  auVar66 = vpmaddwd_avx2(auVar66,auVar10);
  auVar54 = vpaddd_avx2(auVar54,auVar37);
  auVar50 = vpaddd_avx2(auVar50,auVar37);
  auVar55 = vpaddd_avx2(auVar55,auVar37);
  auVar66 = vpaddd_avx2(auVar66,auVar37);
  auVar54 = vpsrad_avx2(auVar54,0xc);
  auVar50 = vpsrad_avx2(auVar50,0xc);
  auVar54 = vpackssdw_avx2(auVar54,auVar50);
  auVar50 = vpsrad_avx2(auVar55,0xc);
  auVar55 = vpsrad_avx2(auVar66,0xc);
  auVar50 = vpackssdw_avx2(auVar50,auVar55);
  alVar84 = (__m256i)vpaddsw_avx2(auVar23,auVar16);
  *output = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar23,auVar16);
  output[0x3f] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar24,auVar17);
  output[1] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar24,auVar17);
  output[0x3e] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar25,auVar18);
  output[2] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar25,auVar18);
  output[0x3d] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar26,auVar19);
  output[3] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar26,auVar19);
  output[0x3c] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar73,auVar20);
  output[4] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar73,auVar20);
  output[0x3b] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar28,auVar58);
  output[5] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar28,auVar58);
  output[0x3a] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar30,auVar21);
  output[6] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar30,auVar21);
  output[0x39] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar59,auVar22);
  output[7] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar59,auVar22);
  output[0x38] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar69,auVar72);
  output[8] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar72,auVar69);
  output[0x37] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar51,auVar60);
  output[9] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar60,auVar51);
  output[0x36] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar68,auVar53);
  output[10] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar68,auVar53);
  output[0x35] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar31,auVar64);
  output[0xb] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar31,auVar64);
  output[0x34] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar32,auVar49);
  output[0xc] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar32,auVar49);
  output[0x33] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar83,auVar2);
  output[0xd] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar2,auVar83);
  output[0x32] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar67,auVar29);
  output[0xe] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar29,auVar67);
  output[0x31] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar50,auVar1);
  output[0xf] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar1,auVar50);
  output[0x30] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar27,auVar54);
  output[0x10] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar27,auVar54);
  output[0x2f] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar40,auVar81);
  output[0x11] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar40,auVar81);
  output[0x2e] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar75,auVar79);
  output[0x12] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar75,auVar79);
  output[0x2d] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar80,auVar78);
  output[0x13] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar80,auVar78);
  output[0x2c] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar82,auVar65);
  output[0x14] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar82,auVar65);
  output[0x2b] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar42,auVar70);
  output[0x15] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar42,auVar70);
  output[0x2a] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar4,auVar52);
  output[0x16] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar4,auVar52);
  output[0x29] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar63,auVar38);
  output[0x17] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar38,auVar63);
  output[0x28] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar3,auVar15);
  output[0x18] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar3,auVar15);
  output[0x27] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar39,auVar14);
  output[0x19] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar39,auVar14);
  output[0x26] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar36,auVar57);
  output[0x1a] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar36,auVar57);
  output[0x25] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar35,auVar13);
  output[0x1b] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar35,auVar13);
  output[0x24] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar34,auVar12);
  output[0x1c] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar34,auVar12);
  output[0x23] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar7,auVar11);
  output[0x1d] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar7,auVar11);
  output[0x22] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar6,auVar62);
  output[0x1e] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar6,auVar62);
  output[0x21] = alVar84;
  alVar84 = (__m256i)vpaddsw_avx2(auVar33,auVar61);
  output[0x1f] = alVar84;
  alVar84 = (__m256i)vpsubsw_avx2(auVar33,auVar61);
  output[0x20] = alVar84;
  return;
}

Assistant:

static void idct64_low32_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  const __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  const __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  const __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m256i x[64];
  x[0] = input[0];
  x[2] = input[16];
  x[4] = input[8];
  x[6] = input[24];
  x[8] = input[4];
  x[10] = input[20];
  x[12] = input[12];
  x[14] = input[28];
  x[16] = input[2];
  x[18] = input[18];
  x[20] = input[10];
  x[22] = input[26];
  x[24] = input[6];
  x[26] = input[22];
  x[28] = input[14];
  x[30] = input[30];
  x[32] = input[1];
  x[34] = input[17];
  x[36] = input[9];
  x[38] = input[25];
  x[40] = input[5];
  x[42] = input[21];
  x[44] = input[13];
  x[46] = input[29];
  x[48] = input[3];
  x[50] = input[19];
  x[52] = input[11];
  x[54] = input[27];
  x[56] = input[7];
  x[58] = input[23];
  x[60] = input[15];
  x[62] = input[31];

  // stage 2
  btf_16_w16_0_avx2(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_w16_0_avx2(-cospi[33], cospi[31], x[62], x[33], x[62]);
  btf_16_w16_0_avx2(cospi[47], cospi[17], x[34], x[34], x[61]);
  btf_16_w16_0_avx2(-cospi[49], cospi[15], x[60], x[35], x[60]);
  btf_16_w16_0_avx2(cospi[55], cospi[9], x[36], x[36], x[59]);
  btf_16_w16_0_avx2(-cospi[41], cospi[23], x[58], x[37], x[58]);
  btf_16_w16_0_avx2(cospi[39], cospi[25], x[38], x[38], x[57]);
  btf_16_w16_0_avx2(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_w16_0_avx2(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_w16_0_avx2(-cospi[37], cospi[27], x[54], x[41], x[54]);
  btf_16_w16_0_avx2(cospi[43], cospi[21], x[42], x[42], x[53]);
  btf_16_w16_0_avx2(-cospi[53], cospi[11], x[52], x[43], x[52]);
  btf_16_w16_0_avx2(cospi[51], cospi[13], x[44], x[44], x[51]);
  btf_16_w16_0_avx2(-cospi[45], cospi[19], x[50], x[45], x[50]);
  btf_16_w16_0_avx2(cospi[35], cospi[29], x[46], x[46], x[49]);
  btf_16_w16_0_avx2(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_w16_0_avx2(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_w16_0_avx2(-cospi[34], cospi[30], x[30], x[17], x[30]);
  btf_16_w16_0_avx2(cospi[46], cospi[18], x[18], x[18], x[29]);
  btf_16_w16_0_avx2(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_w16_0_avx2(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_w16_0_avx2(-cospi[42], cospi[22], x[26], x[21], x[26]);
  btf_16_w16_0_avx2(cospi[38], cospi[26], x[22], x[22], x[25]);
  btf_16_w16_0_avx2(-cospi[58], cospi[6], x[24], x[23], x[24]);
  btf_16_adds_subs_avx2(&x[32], &x[33]);
  btf_16_adds_subs_avx2(&x[35], &x[34]);
  btf_16_adds_subs_avx2(&x[36], &x[37]);
  btf_16_adds_subs_avx2(&x[39], &x[38]);
  btf_16_adds_subs_avx2(&x[40], &x[41]);
  btf_16_adds_subs_avx2(&x[43], &x[42]);
  btf_16_adds_subs_avx2(&x[44], &x[45]);
  btf_16_adds_subs_avx2(&x[47], &x[46]);
  btf_16_adds_subs_avx2(&x[48], &x[49]);
  btf_16_adds_subs_avx2(&x[51], &x[50]);
  btf_16_adds_subs_avx2(&x[52], &x[53]);
  btf_16_adds_subs_avx2(&x[55], &x[54]);
  btf_16_adds_subs_avx2(&x[56], &x[57]);
  btf_16_adds_subs_avx2(&x[59], &x[58]);
  btf_16_adds_subs_avx2(&x[60], &x[61]);
  btf_16_adds_subs_avx2(&x[63], &x[62]);

  // stage 4
  btf_16_w16_0_avx2(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_w16_0_avx2(-cospi[36], cospi[28], x[14], x[9], x[14]);
  btf_16_w16_0_avx2(cospi[44], cospi[20], x[10], x[10], x[13]);
  btf_16_w16_0_avx2(-cospi[52], cospi[12], x[12], x[11], x[12]);
  btf_16_adds_subs_avx2(&x[16], &x[17]);
  btf_16_adds_subs_avx2(&x[19], &x[18]);
  btf_16_adds_subs_avx2(&x[20], &x[21]);
  btf_16_adds_subs_avx2(&x[23], &x[22]);
  btf_16_adds_subs_avx2(&x[24], &x[25]);
  btf_16_adds_subs_avx2(&x[27], &x[26]);
  btf_16_adds_subs_avx2(&x[28], &x[29]);
  btf_16_adds_subs_avx2(&x[31], &x[30]);
  idct64_stage4_high32_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 5
  btf_16_w16_0_avx2(cospi[56], cospi[8], x[4], x[4], x[7]);
  btf_16_w16_0_avx2(-cospi[40], cospi[24], x[6], x[5], x[6]);
  btf_16_adds_subs_avx2(&x[8], &x[9]);
  btf_16_adds_subs_avx2(&x[11], &x[10]);
  btf_16_adds_subs_avx2(&x[12], &x[13]);
  btf_16_adds_subs_avx2(&x[15], &x[14]);
  idct64_stage5_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 6
  btf_16_w16_0_avx2(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_w16_0_avx2(cospi[48], cospi[16], x[2], x[2], x[3]);
  btf_16_adds_subs_avx2(&x[4], &x[5]);
  btf_16_adds_subs_avx2(&x[7], &x[6]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x[9], &x[14], _r, INV_COS_BIT);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x[10], &x[13], _r,
                  INV_COS_BIT);
  idct64_stage6_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 7
  btf_16_adds_subs_avx2(&x[0], &x[3]);
  btf_16_adds_subs_avx2(&x[1], &x[2]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[5], &x[6], _r, INV_COS_BIT);
  btf_16_adds_subs_avx2(&x[8], &x[11]);
  btf_16_adds_subs_avx2(&x[9], &x[10]);
  btf_16_adds_subs_avx2(&x[15], &x[12]);
  btf_16_adds_subs_avx2(&x[14], &x[13]);
  idct64_stage7_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 8
  btf_16_adds_subs_avx2(&x[0], &x[7]);
  btf_16_adds_subs_avx2(&x[1], &x[6]);
  btf_16_adds_subs_avx2(&x[2], &x[5]);
  btf_16_adds_subs_avx2(&x[3], &x[4]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[10], &x[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[11], &x[12], _r,
                  INV_COS_BIT);
  idct64_stage8_high48_avx2(x, cospi, _r, INV_COS_BIT);

  // stage 9~11
  idct64_stage9_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage10_avx2(x, cospi, _r, INV_COS_BIT);
  idct64_stage11_avx2(output, x);
}